

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  RTCRayQueryContext *pRVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  ulong uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [12];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  uint uVar89;
  int iVar90;
  undefined1 (*pauVar91) [32];
  uint uVar92;
  uint uVar93;
  long lVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  float fVar98;
  float fVar100;
  float fVar133;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined4 uVar99;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar105 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  vint4 ai_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  vint4 ai;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar202 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar215;
  float fVar226;
  float fVar227;
  vint4 bi;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar232 [16];
  float fVar233;
  undefined1 auVar236 [16];
  float fVar241;
  float fVar242;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  float fVar243;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar244;
  float fVar245;
  undefined1 auVar240 [64];
  float fVar246;
  float fVar260;
  float fVar261;
  vint4 ai_1;
  float fVar262;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  float fVar279;
  undefined1 auVar274 [16];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float s;
  float fVar284;
  float fVar293;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar289 [64];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  float fVar300;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar301 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_cc8;
  float local_c00;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  RTCFilterFunctionNArguments local_b90;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 (*local_aa8) [32];
  uint local_aa0;
  uint uStack_a9c;
  uint uStack_a98;
  uint uStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  uint uStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  ulong local_9c0;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  Primitive *local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  undefined1 local_620 [32];
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar273 [64];
  undefined1 auVar278 [64];
  
  PVar2 = prim[1];
  uVar96 = (ulong)(byte)PVar2;
  fVar98 = *(float *)(prim + uVar96 * 0x19 + 0x12);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar96 * 0x19 + 6));
  auVar101._0_4_ = fVar98 * auVar7._0_4_;
  auVar101._4_4_ = fVar98 * auVar7._4_4_;
  auVar101._8_4_ = fVar98 * auVar7._8_4_;
  auVar101._12_4_ = fVar98 * auVar7._12_4_;
  auVar216._0_4_ = fVar98 * auVar8._0_4_;
  auVar216._4_4_ = fVar98 * auVar8._4_4_;
  auVar216._8_4_ = fVar98 * auVar8._8_4_;
  auVar216._12_4_ = fVar98 * auVar8._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar96 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar97 = (ulong)(uint)((int)(uVar96 * 9) * 2);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + uVar96 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar97 = (ulong)(uint)((int)(uVar96 * 5) << 2);
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 + 6)));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar289 = ZEXT1664(auVar159);
  auVar297._4_4_ = auVar216._0_4_;
  auVar297._0_4_ = auVar216._0_4_;
  auVar297._8_4_ = auVar216._0_4_;
  auVar297._12_4_ = auVar216._0_4_;
  auVar110 = vshufps_avx(auVar216,auVar216,0x55);
  auVar102 = vshufps_avx(auVar216,auVar216,0xaa);
  fVar98 = auVar102._0_4_;
  auVar270._0_4_ = fVar98 * auVar9._0_4_;
  fVar133 = auVar102._4_4_;
  auVar270._4_4_ = fVar133 * auVar9._4_4_;
  fVar201 = auVar102._8_4_;
  auVar270._8_4_ = fVar201 * auVar9._8_4_;
  fVar100 = auVar102._12_4_;
  auVar270._12_4_ = fVar100 * auVar9._12_4_;
  auVar266._0_4_ = auVar12._0_4_ * fVar98;
  auVar266._4_4_ = auVar12._4_4_ * fVar133;
  auVar266._8_4_ = auVar12._8_4_ * fVar201;
  auVar266._12_4_ = auVar12._12_4_ * fVar100;
  auVar247._0_4_ = auVar159._0_4_ * fVar98;
  auVar247._4_4_ = auVar159._4_4_ * fVar133;
  auVar247._8_4_ = auVar159._8_4_ * fVar201;
  auVar247._12_4_ = auVar159._12_4_ * fVar100;
  auVar102 = vfmadd231ps_fma(auVar270,auVar110,auVar8);
  auVar135 = vfmadd231ps_fma(auVar266,auVar110,auVar11);
  auVar110 = vfmadd231ps_fma(auVar247,auVar103,auVar110);
  auVar183 = vfmadd231ps_fma(auVar102,auVar297,auVar7);
  auVar135 = vfmadd231ps_fma(auVar135,auVar297,auVar10);
  auVar166 = vfmadd231ps_fma(auVar110,auVar104,auVar297);
  auVar298._4_4_ = auVar101._0_4_;
  auVar298._0_4_ = auVar101._0_4_;
  auVar298._8_4_ = auVar101._0_4_;
  auVar298._12_4_ = auVar101._0_4_;
  auVar110 = vshufps_avx(auVar101,auVar101,0x55);
  auVar102 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar98 = auVar102._0_4_;
  auVar217._0_4_ = fVar98 * auVar9._0_4_;
  fVar133 = auVar102._4_4_;
  auVar217._4_4_ = fVar133 * auVar9._4_4_;
  fVar201 = auVar102._8_4_;
  auVar217._8_4_ = fVar201 * auVar9._8_4_;
  fVar100 = auVar102._12_4_;
  auVar217._12_4_ = fVar100 * auVar9._12_4_;
  auVar134._0_4_ = auVar12._0_4_ * fVar98;
  auVar134._4_4_ = auVar12._4_4_ * fVar133;
  auVar134._8_4_ = auVar12._8_4_ * fVar201;
  auVar134._12_4_ = auVar12._12_4_ * fVar100;
  auVar102._0_4_ = auVar159._0_4_ * fVar98;
  auVar102._4_4_ = auVar159._4_4_ * fVar133;
  auVar102._8_4_ = auVar159._8_4_ * fVar201;
  auVar102._12_4_ = auVar159._12_4_ * fVar100;
  auVar8 = vfmadd231ps_fma(auVar217,auVar110,auVar8);
  auVar9 = vfmadd231ps_fma(auVar134,auVar110,auVar11);
  auVar11 = vfmadd231ps_fma(auVar102,auVar110,auVar103);
  auVar12 = vfmadd231ps_fma(auVar8,auVar298,auVar7);
  auVar103 = vfmadd231ps_fma(auVar9,auVar298,auVar10);
  auVar159 = vfmadd231ps_fma(auVar11,auVar298,auVar104);
  auVar234._8_4_ = 0x7fffffff;
  auVar234._0_8_ = 0x7fffffff7fffffff;
  auVar234._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar183,auVar234);
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar202,1);
  auVar8 = vblendvps_avx(auVar183,auVar202,auVar7);
  auVar7 = vandps_avx(auVar135,auVar234);
  auVar7 = vcmpps_avx(auVar7,auVar202,1);
  auVar9 = vblendvps_avx(auVar135,auVar202,auVar7);
  auVar7 = vandps_avx(auVar166,auVar234);
  auVar7 = vcmpps_avx(auVar7,auVar202,1);
  auVar7 = vblendvps_avx(auVar166,auVar202,auVar7);
  auVar10 = vrcpps_avx(auVar8);
  auVar235._8_4_ = 0x3f800000;
  auVar235._0_8_ = 0x3f8000003f800000;
  auVar235._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar10,auVar235);
  auVar10 = vfmadd132ps_fma(auVar8,auVar10,auVar10);
  auVar8 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar8,auVar235);
  auVar11 = vfmadd132ps_fma(auVar9,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar8,auVar235);
  auVar104 = vfmadd132ps_fma(auVar7,auVar8,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar96 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar166._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar166._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar166._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar166._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar96 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar218._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar218._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar218._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar218._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar135._1_3_ = 0;
  auVar135[0] = PVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar96 * -2 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar103);
  auVar248._0_4_ = auVar7._0_4_ * auVar11._0_4_;
  auVar248._4_4_ = auVar7._4_4_ * auVar11._4_4_;
  auVar248._8_4_ = auVar7._8_4_ * auVar11._8_4_;
  auVar248._12_4_ = auVar7._12_4_ * auVar11._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar8);
  auVar7 = vsubps_avx(auVar7,auVar103);
  auVar110._0_4_ = auVar11._0_4_ * auVar7._0_4_;
  auVar110._4_4_ = auVar11._4_4_ * auVar7._4_4_;
  auVar110._8_4_ = auVar11._8_4_ * auVar7._8_4_;
  auVar110._12_4_ = auVar11._12_4_ * auVar7._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar97 + uVar96 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar159);
  auVar183._0_4_ = auVar104._0_4_ * auVar7._0_4_;
  auVar183._4_4_ = auVar104._4_4_ * auVar7._4_4_;
  auVar183._8_4_ = auVar104._8_4_ * auVar7._8_4_;
  auVar183._12_4_ = auVar104._12_4_ * auVar7._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar96 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar12);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar159);
  auVar103._0_4_ = auVar104._0_4_ * auVar7._0_4_;
  auVar103._4_4_ = auVar104._4_4_ * auVar7._4_4_;
  auVar103._8_4_ = auVar104._8_4_ * auVar7._8_4_;
  auVar103._12_4_ = auVar104._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar166,auVar218);
  auVar8 = vpminsd_avx(auVar248,auVar110);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar183,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar263._4_4_ = uVar99;
  auVar263._0_4_ = uVar99;
  auVar263._8_4_ = uVar99;
  auVar263._12_4_ = uVar99;
  auVar8 = vmaxps_avx(auVar8,auVar263);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_6c0._0_4_ = auVar7._0_4_ * 0.99999964;
  local_6c0._4_4_ = auVar7._4_4_ * 0.99999964;
  local_6c0._8_4_ = auVar7._8_4_ * 0.99999964;
  local_6c0._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar166,auVar218);
  auVar8 = vpmaxsd_avx(auVar248,auVar110);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar183,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar159._4_4_ = uVar99;
  auVar159._0_4_ = uVar99;
  auVar159._8_4_ = uVar99;
  auVar159._12_4_ = uVar99;
  auVar8 = vminps_avx(auVar8,auVar159);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar104._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar135[4] = PVar2;
  auVar135._5_3_ = 0;
  auVar135[8] = PVar2;
  auVar135._9_3_ = 0;
  auVar135[0xc] = PVar2;
  auVar135._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar135,_DAT_01f7fcf0);
  auVar7 = vcmpps_avx(local_6c0,auVar104,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  uVar89 = vmovmskps_avx(auVar7);
  if (uVar89 == 0) {
    return;
  }
  uVar89 = uVar89 & 0xff;
  auVar114._16_16_ = mm_lookupmask_ps._240_16_;
  auVar114._0_16_ = mm_lookupmask_ps._240_16_;
  local_7e0 = vblendps_avx(auVar114,ZEXT832(0) << 0x20,0x80);
  local_aa8 = (undefined1 (*) [32])&local_340;
  iVar90 = 1 << ((uint)k & 0x1f);
  auVar115._4_4_ = iVar90;
  auVar115._0_4_ = iVar90;
  auVar115._8_4_ = iVar90;
  auVar115._12_4_ = iVar90;
  auVar115._16_4_ = iVar90;
  auVar115._20_4_ = iVar90;
  auVar115._24_4_ = iVar90;
  auVar115._28_4_ = iVar90;
  auVar179 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar114 = vpand_avx2(auVar115,auVar179);
  local_6a0 = vpcmpeqd_avx2(auVar114,auVar179);
  local_8c0 = 0x7fffffff;
  uStack_8bc = 0x7fffffff;
  uStack_8b8 = 0x7fffffff;
  uStack_8b4 = 0x7fffffff;
  uStack_8b0 = 0x7fffffff;
  uStack_8ac = 0x7fffffff;
  uStack_8a8 = 0x7fffffff;
  uStack_8a4 = 0x7fffffff;
  local_aa0 = 0x80000000;
  uStack_a9c = 0x80000000;
  uStack_a98 = 0x80000000;
  uStack_a94 = 0x80000000;
  fStack_a90 = -0.0;
  fStack_a8c = -0.0;
  fStack_a88 = -0.0;
  uStack_a84 = 0x80000000;
  local_908 = prim;
LAB_0160d6fa:
  lVar94 = 0;
  uVar96 = (ulong)uVar89;
  for (uVar97 = uVar96; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
    lVar94 = lVar94 + 1;
  }
  uVar89 = *(uint *)(local_908 + 2);
  local_660 = *(uint *)(local_908 + lVar94 * 4 + 6);
  local_9c0 = (ulong)local_660;
  pGVar4 = (context->scene->geometries).items[uVar89].ptr;
  uVar97 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_9c0);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar94 = *(long *)&pGVar4[1].time_range.upper;
  auVar7 = *(undefined1 (*) [16])(lVar94 + (long)p_Var5 * uVar97);
  auVar8 = *(undefined1 (*) [16])(lVar94 + (uVar97 + 1) * (long)p_Var5);
  uVar96 = uVar96 - 1 & uVar96;
  if (uVar96 != 0) {
    uVar95 = uVar96 - 1 & uVar96;
    for (uVar23 = uVar96; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    }
    if (uVar95 != 0) {
      for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar10 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar271._4_4_ = uVar99;
  auVar271._0_4_ = uVar99;
  auVar271._8_4_ = uVar99;
  auVar271._12_4_ = uVar99;
  fStack_870 = (float)uVar99;
  _local_880 = auVar271;
  fStack_86c = (float)uVar99;
  fStack_868 = (float)uVar99;
  register0x000014dc = uVar99;
  auVar273 = ZEXT3264(_local_880);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar274._4_4_ = uVar99;
  auVar274._0_4_ = uVar99;
  auVar274._8_4_ = uVar99;
  auVar274._12_4_ = uVar99;
  fStack_850 = (float)uVar99;
  _local_860 = auVar274;
  fStack_84c = (float)uVar99;
  fStack_848 = (float)uVar99;
  register0x0000151c = uVar99;
  auVar278 = ZEXT3264(_local_860);
  auVar9 = vunpcklps_avx(auVar271,auVar274);
  fVar98 = *(float *)(ray + k * 4 + 0xc0);
  auVar267._4_4_ = fVar98;
  auVar267._0_4_ = fVar98;
  auVar267._8_4_ = fVar98;
  auVar267._12_4_ = fVar98;
  local_b40._16_4_ = fVar98;
  local_b40._0_16_ = auVar267;
  local_b40._20_4_ = fVar98;
  local_b40._24_4_ = fVar98;
  local_b40._28_4_ = fVar98;
  local_a10 = vinsertps_avx(auVar9,auVar267,0x28);
  auVar259 = ZEXT1664(local_a10);
  auVar219._0_4_ = (auVar7._0_4_ + auVar8._0_4_) * 0.5;
  auVar219._4_4_ = (auVar7._4_4_ + auVar8._4_4_) * 0.5;
  auVar219._8_4_ = (auVar7._8_4_ + auVar8._8_4_) * 0.5;
  auVar219._12_4_ = (auVar7._12_4_ + auVar8._12_4_) * 0.5;
  auVar9 = vsubps_avx(auVar219,auVar10);
  auVar9 = vdpps_avx(auVar9,local_a10,0x7f);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar265 = ZEXT1664(local_a20);
  auVar11 = vrcpss_avx(local_a20,local_a20);
  auVar12 = vfnmadd213ss_fma(auVar11,local_a20,ZEXT416(0x40000000));
  local_260 = auVar9._0_4_ * auVar11._0_4_ * auVar12._0_4_;
  auVar232._4_4_ = local_260;
  auVar232._0_4_ = local_260;
  auVar232._8_4_ = local_260;
  auVar232._12_4_ = local_260;
  fStack_970 = local_260;
  _local_980 = auVar232;
  fStack_96c = local_260;
  fStack_968 = local_260;
  fStack_964 = local_260;
  auVar9 = vfmadd231ps_fma(auVar10,local_a10,auVar232);
  auVar9 = vblendps_avx(auVar9,_DAT_01f7aa10,8);
  auVar10 = vsubps_avx(auVar7,auVar9);
  auVar11 = vsubps_avx(*(undefined1 (*) [16])(lVar94 + (uVar97 + 2) * (long)p_Var5),auVar9);
  auVar12 = vsubps_avx(auVar8,auVar9);
  auVar9 = vsubps_avx(*(undefined1 (*) [16])(lVar94 + (uVar97 + 3) * (long)p_Var5),auVar9);
  auVar7 = vmovshdup_avx(auVar10);
  local_1e0 = auVar7._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar7 = vshufps_avx(auVar10,auVar10,0xaa);
  local_480 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar10,auVar10,0xff);
  local_200 = auVar7._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar7 = vmovshdup_avx(auVar12);
  local_4a0 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar12,auVar12,0xaa);
  local_4c0 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar12,auVar12,0xff);
  local_4e0 = auVar7._0_8_;
  auVar7 = vmovshdup_avx(auVar11);
  local_500 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar11,auVar11,0xaa);
  local_520 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar11,auVar11,0xff);
  local_540 = auVar7._0_8_;
  auVar7 = vmovshdup_avx(auVar9);
  local_560 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar9,auVar9,0xaa);
  local_580 = auVar7._0_8_;
  auVar7 = vshufps_avx(auVar9,auVar9,0xff);
  local_5a0 = auVar7._0_8_;
  auVar7 = vfmadd231ps_fma(ZEXT432((uint)(fVar98 * fVar98)),_local_860,_local_860);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),_local_880,_local_880);
  uVar99 = auVar7._0_4_;
  local_220._4_4_ = uVar99;
  local_220._0_4_ = uVar99;
  local_220._8_4_ = uVar99;
  local_220._12_4_ = uVar99;
  local_220._16_4_ = uVar99;
  local_220._20_4_ = uVar99;
  local_220._24_4_ = uVar99;
  local_220._28_4_ = uVar99;
  auVar240 = ZEXT3264(local_220);
  fVar98 = *(float *)(ray + k * 4 + 0x60);
  local_920 = ZEXT416((uint)local_260);
  local_260 = fVar98 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_cc8 = 1;
  uVar97 = 0;
  local_5c0 = auVar10._0_4_;
  local_5e0 = auVar12._0_4_;
  local_600 = auVar11._0_4_;
  fVar133 = auVar9._0_4_;
  auVar179._4_4_ = uStack_8bc;
  auVar179._0_4_ = local_8c0;
  auVar179._8_4_ = uStack_8b8;
  auVar179._12_4_ = uStack_8b4;
  auVar179._16_4_ = uStack_8b0;
  auVar179._20_4_ = uStack_8ac;
  auVar179._24_4_ = uStack_8a8;
  auVar179._28_4_ = uStack_8a4;
  local_620 = vandps_avx(local_220,auVar179);
  auVar7 = vsqrtss_avx(local_a20,local_a20);
  auVar8 = vsqrtss_avx(local_a20,local_a20);
  local_6b0 = ZEXT816(0x3f80000000000000);
  local_240 = fVar133;
  fStack_23c = fVar133;
  fStack_238 = fVar133;
  fStack_234 = fVar133;
  fStack_230 = fVar133;
  fStack_22c = fVar133;
  fStack_228 = fVar133;
  fStack_224 = fVar133;
  uStack_65c = local_660;
  uStack_658 = local_660;
  uStack_654 = local_660;
  uStack_650 = local_660;
  uStack_64c = local_660;
  uStack_648 = local_660;
  uStack_644 = local_660;
  local_640 = uVar89;
  uStack_63c = uVar89;
  uStack_638 = uVar89;
  uStack_634 = uVar89;
  uStack_630 = uVar89;
  uStack_62c = uVar89;
  uStack_628 = uVar89;
  uStack_624 = uVar89;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uStack_5dc = local_5e0;
  uStack_5d8 = local_5e0;
  uStack_5d4 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5cc = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5c4 = local_5e0;
  uStack_5bc = local_5c0;
  uStack_5b8 = local_5c0;
  uStack_5b4 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5ac = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_5a4 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  do {
    iVar90 = (int)uVar97;
    auVar104 = vmovshdup_avx(local_6b0);
    auVar104 = vsubps_avx(auVar104,local_6b0);
    local_9a0._0_4_ = auVar104._0_4_;
    fVar201 = (float)local_9a0._0_4_ * 0.04761905;
    uVar99 = local_6b0._0_4_;
    local_a80._4_4_ = uVar99;
    local_a80._0_4_ = uVar99;
    local_a80._8_4_ = uVar99;
    local_a80._12_4_ = uVar99;
    local_a80._16_4_ = uVar99;
    local_a80._20_4_ = uVar99;
    local_a80._24_4_ = uVar99;
    local_a80._28_4_ = uVar99;
    local_9a0._4_4_ = local_9a0._0_4_;
    local_9a0._8_4_ = local_9a0._0_4_;
    local_9a0._12_4_ = local_9a0._0_4_;
    local_9a0._16_4_ = local_9a0._0_4_;
    local_9a0._20_4_ = local_9a0._0_4_;
    local_9a0._24_4_ = local_9a0._0_4_;
    local_9a0._28_4_ = local_9a0._0_4_;
    auVar104 = vfmadd231ps_fma(local_a80,local_9a0,_DAT_01faff20);
    auVar116._8_4_ = 0x3f800000;
    auVar116._0_8_ = 0x3f8000003f800000;
    auVar116._12_4_ = 0x3f800000;
    auVar116._16_4_ = 0x3f800000;
    auVar116._20_4_ = 0x3f800000;
    auVar116._24_4_ = 0x3f800000;
    auVar116._28_4_ = 0x3f800000;
    auVar114 = vsubps_avx(auVar116,ZEXT1632(auVar104));
    fVar212 = auVar104._0_4_;
    fVar292 = auVar104._4_4_;
    fVar213 = auVar104._8_4_;
    fVar214 = auVar104._12_4_;
    fVar100 = auVar114._0_4_;
    fVar233 = auVar114._4_4_;
    fVar241 = auVar114._8_4_;
    fVar242 = auVar114._12_4_;
    fVar243 = auVar114._16_4_;
    fVar244 = auVar114._20_4_;
    fVar245 = auVar114._24_4_;
    auVar240._0_28_ =
         ZEXT1628(CONCAT412(fVar214 * fVar214,
                            CONCAT48(fVar213 * fVar213,CONCAT44(fVar292 * fVar292,fVar212 * fVar212)
                                    )));
    fVar246 = fVar212 * 3.0;
    fVar260 = fVar292 * 3.0;
    fVar261 = fVar213 * 3.0;
    fVar262 = fVar214 * 3.0;
    auVar181._0_4_ = fVar100 * fVar100;
    auVar181._4_4_ = fVar233 * fVar233;
    auVar181._8_4_ = fVar241 * fVar241;
    auVar181._12_4_ = fVar242 * fVar242;
    auVar181._16_4_ = fVar243 * fVar243;
    auVar181._20_4_ = fVar244 * fVar244;
    auVar181._28_36_ = auVar273._28_36_;
    auVar181._24_4_ = fVar245 * fVar245;
    auVar273._0_4_ = (auVar181._0_4_ * (fVar100 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._4_4_ = (auVar181._4_4_ * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._8_4_ = (auVar181._8_4_ * (fVar241 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._12_4_ = (auVar181._12_4_ * (fVar242 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._16_4_ = (auVar181._16_4_ * (fVar243 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._20_4_ = (auVar181._20_4_ * (fVar244 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar273._28_36_ = auVar289._28_36_;
    auVar273._24_4_ = (auVar181._24_4_ * (fVar245 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar179 = auVar273._0_32_;
    fVar215 = fVar212 * fVar212 * (float)((uint)fVar100 ^ local_aa0) * 0.5;
    fVar226 = fVar292 * fVar292 * (float)((uint)fVar233 ^ uStack_a9c) * 0.5;
    fVar227 = fVar213 * fVar213 * (float)((uint)fVar241 ^ uStack_a98) * 0.5;
    fVar228 = fVar214 * fVar214 * (float)((uint)fVar242 ^ uStack_a94) * 0.5;
    fVar229 = (float)((uint)fVar243 ^ (uint)fStack_a90) * 0.0 * 0.0 * 0.5;
    fVar230 = (float)((uint)fVar244 ^ (uint)fStack_a8c) * 0.0 * 0.0 * 0.5;
    fVar231 = (float)((uint)fVar245 ^ (uint)fStack_a88) * 0.0 * 0.0 * 0.5;
    auVar169._0_4_ = local_240 * fVar215;
    auVar169._4_4_ = fStack_23c * fVar226;
    auVar169._8_4_ = fStack_238 * fVar227;
    auVar169._12_4_ = fStack_234 * fVar228;
    auVar169._16_4_ = fStack_230 * fVar229;
    auVar169._20_4_ = fStack_22c * fVar230;
    auVar169._24_4_ = fStack_228 * fVar231;
    auVar169._28_4_ = 0;
    auVar13._4_4_ = fVar226 * local_560._4_4_;
    auVar13._0_4_ = fVar215 * (float)local_560;
    auVar13._8_4_ = fVar227 * (float)uStack_558;
    auVar13._12_4_ = fVar228 * uStack_558._4_4_;
    auVar13._16_4_ = fVar229 * (float)uStack_550;
    auVar13._20_4_ = fVar230 * uStack_550._4_4_;
    auVar13._24_4_ = fVar231 * (float)uStack_548;
    auVar13._28_4_ = auVar114._28_4_ ^ uStack_a84;
    auVar15._4_4_ = fVar226 * local_580._4_4_;
    auVar15._0_4_ = fVar215 * (float)local_580;
    auVar15._8_4_ = fVar227 * (float)uStack_578;
    auVar15._12_4_ = fVar228 * uStack_578._4_4_;
    auVar15._16_4_ = fVar229 * (float)uStack_570;
    auVar15._20_4_ = fVar230 * uStack_570._4_4_;
    auVar15._24_4_ = fVar231 * (float)uStack_568;
    auVar15._28_4_ = 0x40000000;
    auVar123._4_4_ = fVar226 * local_5a0._4_4_;
    auVar123._0_4_ = fVar215 * (float)local_5a0;
    auVar123._8_4_ = fVar227 * (float)uStack_598;
    auVar123._12_4_ = fVar228 * uStack_598._4_4_;
    auVar123._16_4_ = fVar229 * (float)uStack_590;
    auVar123._20_4_ = fVar230 * uStack_590._4_4_;
    auVar123._24_4_ = fVar231 * (float)uStack_588;
    auVar123._28_4_ = uStack_a84;
    auVar146._4_4_ = uStack_5fc;
    auVar146._0_4_ = local_600;
    auVar146._8_4_ = uStack_5f8;
    auVar146._12_4_ = uStack_5f4;
    auVar146._16_4_ = uStack_5f0;
    auVar146._20_4_ = uStack_5ec;
    auVar146._24_4_ = uStack_5e8;
    auVar146._28_4_ = uStack_5e4;
    auVar104 = vfmadd231ps_fma(auVar169,auVar179,auVar146);
    auVar74._8_8_ = uStack_4f8;
    auVar74._0_8_ = local_500;
    auVar74._16_8_ = uStack_4f0;
    auVar74._24_8_ = uStack_4e8;
    auVar103 = vfmadd231ps_fma(auVar13,auVar179,auVar74);
    auVar72._8_8_ = uStack_518;
    auVar72._0_8_ = local_520;
    auVar72._16_8_ = uStack_510;
    auVar72._24_8_ = uStack_508;
    auVar159 = vfmadd231ps_fma(auVar15,auVar179,auVar72);
    auVar70._8_8_ = uStack_538;
    auVar70._0_8_ = local_540;
    auVar70._16_8_ = uStack_530;
    auVar70._24_8_ = uStack_528;
    auVar110 = vfmadd231ps_fma(auVar123,auVar179,auVar70);
    auVar16._4_4_ = fVar233 * fVar233 * (float)((uint)fVar292 ^ uStack_a9c) * 0.5;
    auVar16._0_4_ = fVar100 * fVar100 * (float)((uint)fVar212 ^ local_aa0) * 0.5;
    auVar16._8_4_ = fVar241 * fVar241 * (float)((uint)fVar213 ^ uStack_a98) * 0.5;
    auVar16._12_4_ = fVar242 * fVar242 * (float)((uint)fVar214 ^ uStack_a94) * 0.5;
    auVar16._16_4_ = fVar243 * fVar243 * fStack_a90 * 0.5;
    auVar16._20_4_ = fVar244 * fVar244 * fStack_a8c * 0.5;
    auVar16._24_4_ = fVar245 * fVar245 * fStack_a88 * 0.5;
    auVar16._28_4_ = auVar278._28_4_;
    auVar118._4_4_ = ((fVar260 + -5.0) * fVar292 * fVar292 + 2.0) * 0.5;
    auVar118._0_4_ = ((fVar246 + -5.0) * fVar212 * fVar212 + 2.0) * 0.5;
    auVar118._8_4_ = ((fVar261 + -5.0) * fVar213 * fVar213 + 2.0) * 0.5;
    auVar118._12_4_ = ((fVar262 + -5.0) * fVar214 * fVar214 + 2.0) * 0.5;
    auVar118._16_4_ = 0x3f800000;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = auVar289._28_4_ + 2.0;
    auVar66._4_4_ = uStack_5dc;
    auVar66._0_4_ = local_5e0;
    auVar66._8_4_ = uStack_5d8;
    auVar66._12_4_ = uStack_5d4;
    auVar66._16_4_ = uStack_5d0;
    auVar66._20_4_ = uStack_5cc;
    auVar66._24_4_ = uStack_5c8;
    auVar66._28_4_ = uStack_5c4;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar118,auVar66);
    auVar80._8_8_ = uStack_498;
    auVar80._0_8_ = local_4a0;
    auVar80._16_8_ = uStack_490;
    auVar80._24_8_ = uStack_488;
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar118,auVar80);
    auVar78._8_8_ = uStack_4b8;
    auVar78._0_8_ = local_4c0;
    auVar78._16_8_ = uStack_4b0;
    auVar78._24_8_ = uStack_4a8;
    auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar118,auVar78);
    auVar76._8_8_ = uStack_4d8;
    auVar76._0_8_ = local_4e0;
    auVar76._16_8_ = uStack_4d0;
    auVar76._24_8_ = uStack_4c8;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar118,auVar76);
    auVar68._4_4_ = uStack_5bc;
    auVar68._0_4_ = local_5c0;
    auVar68._8_4_ = uStack_5b8;
    auVar68._12_4_ = uStack_5b4;
    auVar68._16_4_ = uStack_5b0;
    auVar68._20_4_ = uStack_5ac;
    auVar68._24_4_ = uStack_5a8;
    auVar68._28_4_ = uStack_5a4;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar16,auVar68);
    auVar88._8_8_ = uStack_1d8;
    auVar88._0_8_ = local_1e0;
    auVar88._16_8_ = uStack_1d0;
    auVar88._24_8_ = uStack_1c8;
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar16,auVar88);
    auVar146 = ZEXT1632(auVar103);
    auVar82._8_8_ = uStack_478;
    auVar82._0_8_ = local_480;
    auVar82._16_8_ = uStack_470;
    auVar82._24_8_ = uStack_468;
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar16,auVar82);
    auVar87._8_8_ = uStack_1f8;
    auVar87._0_8_ = local_200;
    auVar87._16_8_ = uStack_1f0;
    auVar87._24_8_ = uStack_1e8;
    auVar159 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar87,auVar16);
    auVar255._4_4_ = (fVar233 + fVar233) * fVar292;
    auVar255._0_4_ = (fVar100 + fVar100) * fVar212;
    auVar255._8_4_ = (fVar241 + fVar241) * fVar213;
    auVar255._12_4_ = (fVar242 + fVar242) * fVar214;
    auVar255._16_4_ = (fVar243 + fVar243) * 0.0;
    auVar255._20_4_ = (fVar244 + fVar244) * 0.0;
    auVar255._24_4_ = (fVar245 + fVar245) * 0.0;
    auVar255._28_4_ = 0;
    auVar179 = vsubps_avx(auVar255,auVar181._0_32_);
    fVar215 = auVar259._28_4_ + 2.0;
    auVar17._4_4_ = (fVar233 + fVar233) * (fVar260 + 2.0);
    auVar17._0_4_ = (fVar100 + fVar100) * (fVar246 + 2.0);
    auVar17._8_4_ = (fVar241 + fVar241) * (fVar261 + 2.0);
    auVar17._12_4_ = (fVar242 + fVar242) * (fVar262 + 2.0);
    auVar17._16_4_ = (fVar243 + fVar243) * 2.0;
    auVar17._20_4_ = (fVar244 + fVar244) * 2.0;
    auVar17._24_4_ = (fVar245 + fVar245) * 2.0;
    auVar17._28_4_ = fVar215;
    auVar18._4_4_ = fVar233 * 3.0 * fVar233;
    auVar18._0_4_ = fVar100 * 3.0 * fVar100;
    auVar18._8_4_ = fVar241 * 3.0 * fVar241;
    auVar18._12_4_ = fVar242 * 3.0 * fVar242;
    auVar18._16_4_ = fVar243 * 3.0 * fVar243;
    auVar18._20_4_ = fVar244 * 3.0 * fVar244;
    auVar18._24_4_ = fVar245 * 3.0 * fVar245;
    auVar18._28_4_ = auVar114._28_4_;
    auVar114 = vsubps_avx(auVar17,auVar18);
    auVar115 = vsubps_avx(auVar240._0_32_,auVar255);
    auVar19._4_4_ = auVar179._4_4_ * 0.5;
    auVar19._0_4_ = auVar179._0_4_ * 0.5;
    auVar19._8_4_ = auVar179._8_4_ * 0.5;
    auVar19._12_4_ = auVar179._12_4_ * 0.5;
    auVar19._16_4_ = auVar179._16_4_ * 0.5;
    auVar19._20_4_ = auVar179._20_4_ * 0.5;
    auVar19._24_4_ = auVar179._24_4_ * 0.5;
    auVar19._28_4_ = fVar215;
    auVar20._28_4_ = auVar259._28_4_ + -5.0 + 0.0;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(((fVar214 + fVar214) * (fVar262 + -5.0) + fVar262 * fVar214) * 0.5,
                            CONCAT48(((fVar213 + fVar213) * (fVar261 + -5.0) + fVar261 * fVar213) *
                                     0.5,CONCAT44(((fVar292 + fVar292) * (fVar260 + -5.0) +
                                                  fVar260 * fVar292) * 0.5,
                                                  ((fVar212 + fVar212) * (fVar246 + -5.0) +
                                                  fVar246 * fVar212) * 0.5))));
    auVar21._4_4_ = auVar114._4_4_ * 0.5;
    auVar21._0_4_ = auVar114._0_4_ * 0.5;
    auVar21._8_4_ = auVar114._8_4_ * 0.5;
    auVar21._12_4_ = auVar114._12_4_ * 0.5;
    auVar21._16_4_ = auVar114._16_4_ * 0.5;
    auVar21._20_4_ = auVar114._20_4_ * 0.5;
    fVar100 = auVar114._28_4_;
    auVar21._24_4_ = auVar114._24_4_ * 0.5;
    auVar21._28_4_ = fVar100;
    fVar233 = auVar115._0_4_ * 0.5;
    fVar241 = auVar115._4_4_ * 0.5;
    fVar242 = auVar115._8_4_ * 0.5;
    fVar243 = auVar115._12_4_ * 0.5;
    fVar244 = auVar115._16_4_ * 0.5;
    fVar245 = auVar115._20_4_ * 0.5;
    fVar215 = auVar115._24_4_ * 0.5;
    auVar119._4_4_ = fStack_23c * fVar241;
    auVar119._0_4_ = local_240 * fVar233;
    auVar119._8_4_ = fStack_238 * fVar242;
    auVar119._12_4_ = fStack_234 * fVar243;
    auVar119._16_4_ = fStack_230 * fVar244;
    auVar119._20_4_ = fStack_22c * fVar245;
    auVar119._24_4_ = fStack_228 * fVar215;
    auVar119._28_4_ = auVar265._28_4_;
    auVar170._4_4_ = fVar241 * local_560._4_4_;
    auVar170._0_4_ = fVar233 * (float)local_560;
    auVar170._8_4_ = fVar242 * (float)uStack_558;
    auVar170._12_4_ = fVar243 * uStack_558._4_4_;
    auVar170._16_4_ = fVar244 * (float)uStack_550;
    auVar170._20_4_ = fVar245 * uStack_550._4_4_;
    auVar170._24_4_ = fVar215 * (float)uStack_548;
    auVar170._28_4_ = 0x40000000;
    auVar222._4_4_ = fVar241 * local_580._4_4_;
    auVar222._0_4_ = fVar233 * (float)local_580;
    auVar222._8_4_ = fVar242 * (float)uStack_578;
    auVar222._12_4_ = fVar243 * uStack_578._4_4_;
    auVar222._16_4_ = fVar244 * (float)uStack_570;
    auVar222._20_4_ = fVar245 * uStack_570._4_4_;
    auVar222._24_4_ = fVar215 * (float)uStack_568;
    auVar222._28_4_ = auVar179._28_4_;
    auVar272._4_4_ = fVar241 * local_5a0._4_4_;
    auVar272._0_4_ = fVar233 * (float)local_5a0;
    auVar272._8_4_ = fVar242 * (float)uStack_598;
    auVar272._12_4_ = fVar243 * uStack_598._4_4_;
    auVar272._16_4_ = fVar244 * (float)uStack_590;
    auVar272._20_4_ = fVar245 * uStack_590._4_4_;
    auVar272._24_4_ = fVar215 * (float)uStack_588;
    auVar272._28_4_ = auVar115._28_4_;
    auVar65._4_4_ = uStack_5fc;
    auVar65._0_4_ = local_600;
    auVar65._8_4_ = uStack_5f8;
    auVar65._12_4_ = uStack_5f4;
    auVar65._16_4_ = uStack_5f0;
    auVar65._20_4_ = uStack_5ec;
    auVar65._24_4_ = uStack_5e8;
    auVar65._28_4_ = uStack_5e4;
    auVar110 = vfmadd231ps_fma(auVar119,auVar21,auVar65);
    auVar75._8_8_ = uStack_4f8;
    auVar75._0_8_ = local_500;
    auVar75._16_8_ = uStack_4f0;
    auVar75._24_8_ = uStack_4e8;
    auVar102 = vfmadd231ps_fma(auVar170,auVar21,auVar75);
    auVar73._8_8_ = uStack_518;
    auVar73._0_8_ = local_520;
    auVar73._16_8_ = uStack_510;
    auVar73._24_8_ = uStack_508;
    auVar135 = vfmadd231ps_fma(auVar222,auVar21,auVar73);
    auVar71._8_8_ = uStack_538;
    auVar71._0_8_ = local_540;
    auVar71._16_8_ = uStack_530;
    auVar71._24_8_ = uStack_528;
    auVar183 = vfmadd231ps_fma(auVar272,auVar21,auVar71);
    auVar67._4_4_ = uStack_5dc;
    auVar67._0_4_ = local_5e0;
    auVar67._8_4_ = uStack_5d8;
    auVar67._12_4_ = uStack_5d4;
    auVar67._16_4_ = uStack_5d0;
    auVar67._20_4_ = uStack_5cc;
    auVar67._24_4_ = uStack_5c8;
    auVar67._28_4_ = uStack_5c4;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar20,auVar67);
    auVar81._8_8_ = uStack_498;
    auVar81._0_8_ = local_4a0;
    auVar81._16_8_ = uStack_490;
    auVar81._24_8_ = uStack_488;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar20,auVar81);
    auVar79._8_8_ = uStack_4b8;
    auVar79._0_8_ = local_4c0;
    auVar79._16_8_ = uStack_4b0;
    auVar79._24_8_ = uStack_4a8;
    auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar20,auVar79);
    auVar77._8_8_ = uStack_4d8;
    auVar77._0_8_ = local_4e0;
    auVar77._16_8_ = uStack_4d0;
    auVar77._24_8_ = uStack_4c8;
    auVar183 = vfmadd231ps_fma(ZEXT1632(auVar183),auVar20,auVar77);
    auVar69._4_4_ = uStack_5bc;
    auVar69._0_4_ = local_5c0;
    auVar69._8_4_ = uStack_5b8;
    auVar69._12_4_ = uStack_5b4;
    auVar69._16_4_ = uStack_5b0;
    auVar69._20_4_ = uStack_5ac;
    auVar69._24_4_ = uStack_5a8;
    auVar69._28_4_ = uStack_5a4;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar19,auVar69);
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar19,auVar88);
    auVar83._8_8_ = uStack_478;
    auVar83._0_8_ = local_480;
    auVar83._16_8_ = uStack_470;
    auVar83._24_8_ = uStack_468;
    auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),auVar19,auVar83);
    auVar183 = vfmadd231ps_fma(ZEXT1632(auVar183),auVar87,auVar19);
    local_820._0_4_ = auVar110._0_4_ * fVar201;
    local_820._4_4_ = auVar110._4_4_ * fVar201;
    local_820._8_4_ = auVar110._8_4_ * fVar201;
    local_820._12_4_ = auVar110._12_4_ * fVar201;
    local_820._16_4_ = fVar201 * 0.0;
    local_820._20_4_ = fVar201 * 0.0;
    local_820._24_4_ = fVar201 * 0.0;
    local_820._28_4_ = 0;
    fVar244 = auVar102._0_4_ * fVar201;
    fVar226 = auVar102._4_4_ * fVar201;
    local_b20._4_4_ = fVar226;
    local_b20._0_4_ = fVar244;
    fVar229 = auVar102._8_4_ * fVar201;
    local_b20._8_4_ = fVar229;
    fVar292 = auVar102._12_4_ * fVar201;
    local_b20._12_4_ = fVar292;
    local_b20._16_4_ = fVar201 * 0.0;
    local_b20._20_4_ = fVar201 * 0.0;
    local_b20._24_4_ = fVar201 * 0.0;
    local_b20._28_4_ = 0;
    fVar300 = auVar135._0_4_ * fVar201;
    fVar302 = auVar135._4_4_ * fVar201;
    auVar299._4_4_ = fVar302;
    auVar299._0_4_ = fVar300;
    fVar303 = auVar135._8_4_ * fVar201;
    auVar299._8_4_ = fVar303;
    fVar304 = auVar135._12_4_ * fVar201;
    auVar299._12_4_ = fVar304;
    fVar305 = fVar201 * 0.0;
    auVar299._16_4_ = fVar305;
    fVar306 = fVar201 * 0.0;
    auVar299._20_4_ = fVar306;
    fVar307 = fVar201 * 0.0;
    auVar299._24_4_ = fVar307;
    auVar299._28_4_ = 0x3f000000;
    fVar233 = fVar201 * auVar183._0_4_;
    fVar241 = fVar201 * auVar183._4_4_;
    auVar301._4_4_ = fVar241;
    auVar301._0_4_ = fVar233;
    fVar242 = fVar201 * auVar183._8_4_;
    auVar301._8_4_ = fVar242;
    fVar243 = fVar201 * auVar183._12_4_;
    auVar301._12_4_ = fVar243;
    auVar301._16_4_ = fVar201 * 0.0;
    auVar301._20_4_ = fVar201 * 0.0;
    auVar301._24_4_ = fVar201 * 0.0;
    auVar301._28_4_ = fVar100;
    auVar170 = ZEXT1632(auVar104);
    auVar18 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar104));
    _local_960 = vpermps_avx2(_DAT_01fec480,auVar146);
    local_b00 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar103));
    auVar15 = vsubps_avx(auVar18,auVar170);
    auVar123 = vsubps_avx(local_b00,ZEXT1632(auVar103));
    fVar245 = auVar123._0_4_;
    fVar215 = auVar123._4_4_;
    auVar210._4_4_ = fVar215 * local_820._4_4_;
    auVar210._0_4_ = fVar245 * local_820._0_4_;
    fVar227 = auVar123._8_4_;
    auVar210._8_4_ = fVar227 * local_820._8_4_;
    fVar228 = auVar123._12_4_;
    auVar210._12_4_ = fVar228 * local_820._12_4_;
    fVar230 = auVar123._16_4_;
    auVar210._16_4_ = fVar230 * local_820._16_4_;
    fVar231 = auVar123._20_4_;
    auVar210._20_4_ = fVar231 * local_820._20_4_;
    fVar212 = auVar123._24_4_;
    auVar210._24_4_ = fVar212 * local_820._24_4_;
    auVar210._28_4_ = local_b00._28_4_;
    auVar104 = vfmsub231ps_fma(auVar210,auVar299,auVar15);
    auVar16 = vsubps_avx(_local_960,auVar146);
    fVar261 = auVar15._0_4_;
    fVar262 = auVar15._4_4_;
    auVar14._4_4_ = fVar262 * fVar226;
    auVar14._0_4_ = fVar261 * fVar244;
    fVar279 = auVar15._8_4_;
    auVar14._8_4_ = fVar279 * fVar229;
    fVar280 = auVar15._12_4_;
    auVar14._12_4_ = fVar280 * fVar292;
    fVar281 = auVar15._16_4_;
    auVar14._16_4_ = fVar281 * fVar201 * 0.0;
    fVar282 = auVar15._20_4_;
    auVar14._20_4_ = fVar282 * fVar201 * 0.0;
    fVar283 = auVar15._24_4_;
    auVar14._24_4_ = fVar283 * fVar201 * 0.0;
    auVar14._28_4_ = local_960._28_4_;
    auVar110 = vfmsub231ps_fma(auVar14,local_820,auVar16);
    auVar104 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                                    auVar110._0_4_ * auVar110._0_4_)
                                                          ))),ZEXT1632(auVar104),ZEXT1632(auVar104))
    ;
    fVar226 = auVar16._0_4_;
    fVar229 = auVar16._4_4_;
    auVar24._4_4_ = fVar229 * fVar302;
    auVar24._0_4_ = fVar226 * fVar300;
    fVar292 = auVar16._8_4_;
    auVar24._8_4_ = fVar292 * fVar303;
    fVar213 = auVar16._12_4_;
    auVar24._12_4_ = fVar213 * fVar304;
    fVar214 = auVar16._16_4_;
    auVar24._16_4_ = fVar214 * fVar305;
    fVar246 = auVar16._20_4_;
    auVar24._20_4_ = fVar246 * fVar306;
    fVar260 = auVar16._24_4_;
    auVar24._24_4_ = fVar260 * fVar307;
    auVar24._28_4_ = 0;
    auVar102 = vfmsub231ps_fma(auVar24,local_b20,auVar123);
    auVar196._0_4_ = fVar245 * fVar245;
    auVar196._4_4_ = fVar215 * fVar215;
    auVar196._8_4_ = fVar227 * fVar227;
    auVar196._12_4_ = fVar228 * fVar228;
    auVar196._16_4_ = fVar230 * fVar230;
    auVar196._20_4_ = fVar231 * fVar231;
    auVar196._24_4_ = fVar212 * fVar212;
    auVar196._28_4_ = 0;
    auVar110 = vfmadd231ps_fma(auVar196,auVar16,auVar16);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar15,auVar15);
    auVar114 = vrcpps_avx(ZEXT1632(auVar110));
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT1632(auVar102),ZEXT1632(auVar102));
    auVar171._8_4_ = 0x3f800000;
    auVar171._0_8_ = 0x3f8000003f800000;
    auVar171._12_4_ = 0x3f800000;
    auVar171._16_4_ = 0x3f800000;
    auVar171._20_4_ = 0x3f800000;
    auVar171._24_4_ = 0x3f800000;
    auVar171._28_4_ = 0x3f800000;
    auVar104 = vfnmadd213ps_fma(auVar114,ZEXT1632(auVar110),auVar171);
    auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar114,auVar114);
    local_a40 = vpermps_avx2(_DAT_01fec480,local_820);
    local_a60 = vpermps_avx2(_DAT_01fec480,auVar299);
    auVar25._4_4_ = fVar215 * local_a40._4_4_;
    auVar25._0_4_ = fVar245 * local_a40._0_4_;
    auVar25._8_4_ = fVar227 * local_a40._8_4_;
    auVar25._12_4_ = fVar228 * local_a40._12_4_;
    auVar25._16_4_ = fVar230 * local_a40._16_4_;
    auVar25._20_4_ = fVar231 * local_a40._20_4_;
    auVar25._24_4_ = fVar212 * local_a40._24_4_;
    auVar25._28_4_ = auVar114._28_4_;
    auVar135 = vfmsub231ps_fma(auVar25,local_a60,auVar15);
    auVar19 = vpermps_avx2(_DAT_01fec480,local_b20);
    auVar26._4_4_ = fVar262 * auVar19._4_4_;
    auVar26._0_4_ = fVar261 * auVar19._0_4_;
    auVar26._8_4_ = fVar279 * auVar19._8_4_;
    auVar26._12_4_ = fVar280 * auVar19._12_4_;
    auVar26._16_4_ = fVar281 * auVar19._16_4_;
    auVar26._20_4_ = fVar282 * auVar19._20_4_;
    auVar26._24_4_ = fVar283 * auVar19._24_4_;
    auVar26._28_4_ = 0;
    auVar183 = vfmsub231ps_fma(auVar26,local_a40,auVar16);
    auVar135 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar183._12_4_ * auVar183._12_4_,
                                                  CONCAT48(auVar183._8_4_ * auVar183._8_4_,
                                                           CONCAT44(auVar183._4_4_ * auVar183._4_4_,
                                                                    auVar183._0_4_ * auVar183._0_4_)
                                                          ))),ZEXT1632(auVar135),ZEXT1632(auVar135))
    ;
    auVar249._0_4_ = fVar226 * local_a60._0_4_;
    auVar249._4_4_ = fVar229 * local_a60._4_4_;
    auVar249._8_4_ = fVar292 * local_a60._8_4_;
    auVar249._12_4_ = fVar213 * local_a60._12_4_;
    auVar249._16_4_ = fVar214 * local_a60._16_4_;
    auVar249._20_4_ = fVar246 * local_a60._20_4_;
    auVar249._24_4_ = fVar260 * local_a60._24_4_;
    auVar249._28_4_ = 0;
    auVar183 = vfmsub231ps_fma(auVar249,auVar19,auVar123);
    auVar135 = vfmadd231ps_fma(ZEXT1632(auVar135),ZEXT1632(auVar183),ZEXT1632(auVar183));
    auVar114 = vmaxps_avx(ZEXT1632(CONCAT412(auVar102._12_4_ * auVar104._12_4_,
                                             CONCAT48(auVar102._8_4_ * auVar104._8_4_,
                                                      CONCAT44(auVar102._4_4_ * auVar104._4_4_,
                                                               auVar102._0_4_ * auVar104._0_4_)))),
                          ZEXT1632(CONCAT412(auVar135._12_4_ * auVar104._12_4_,
                                             CONCAT48(auVar135._8_4_ * auVar104._8_4_,
                                                      CONCAT44(auVar135._4_4_ * auVar104._4_4_,
                                                               auVar135._0_4_ * auVar104._0_4_)))));
    local_840._0_4_ = auVar159._0_4_ + fVar233;
    local_840._4_4_ = auVar159._4_4_ + fVar241;
    local_840._8_4_ = auVar159._8_4_ + fVar242;
    local_840._12_4_ = auVar159._12_4_ + fVar243;
    local_840._16_4_ = fVar201 * 0.0 + 0.0;
    local_840._20_4_ = fVar201 * 0.0 + 0.0;
    local_840._24_4_ = fVar201 * 0.0 + 0.0;
    local_840._28_4_ = fVar100 + 0.0;
    auVar222 = ZEXT1632(auVar159);
    auVar179 = vsubps_avx(auVar222,auVar301);
    auVar20 = vpermps_avx2(_DAT_01fec480,auVar179);
    auVar21 = vpermps_avx2(_DAT_01fec480,auVar222);
    auVar179 = vmaxps_avx(auVar222,local_840);
    auVar115 = vmaxps_avx(auVar20,auVar21);
    auVar13 = vrsqrtps_avx(ZEXT1632(auVar110));
    auVar179 = vmaxps_avx(auVar179,auVar115);
    fVar201 = auVar13._0_4_;
    fVar100 = auVar13._4_4_;
    fVar233 = auVar13._8_4_;
    fVar241 = auVar13._12_4_;
    fVar242 = auVar13._16_4_;
    fVar243 = auVar13._20_4_;
    fVar244 = auVar13._24_4_;
    auVar27._4_4_ = fVar100 * fVar100 * fVar100 * auVar110._4_4_ * -0.5;
    auVar27._0_4_ = fVar201 * fVar201 * fVar201 * auVar110._0_4_ * -0.5;
    auVar27._8_4_ = fVar233 * fVar233 * fVar233 * auVar110._8_4_ * -0.5;
    auVar27._12_4_ = fVar241 * fVar241 * fVar241 * auVar110._12_4_ * -0.5;
    auVar27._16_4_ = fVar242 * fVar242 * fVar242 * -0.0;
    auVar27._20_4_ = fVar243 * fVar243 * fVar243 * -0.0;
    auVar27._24_4_ = fVar244 * fVar244 * fVar244 * -0.0;
    auVar27._28_4_ = local_840._28_4_;
    auVar117._8_4_ = 0x3fc00000;
    auVar117._0_8_ = 0x3fc000003fc00000;
    auVar117._12_4_ = 0x3fc00000;
    auVar117._16_4_ = 0x3fc00000;
    auVar117._20_4_ = 0x3fc00000;
    auVar117._24_4_ = 0x3fc00000;
    auVar117._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_fma(auVar27,auVar117,auVar13);
    fVar100 = auVar104._0_4_;
    fVar241 = auVar104._4_4_;
    auVar28._4_4_ = fVar229 * fVar241;
    auVar28._0_4_ = fVar226 * fVar100;
    fVar244 = auVar104._8_4_;
    auVar28._8_4_ = fVar292 * fVar244;
    fVar226 = auVar104._12_4_;
    auVar28._12_4_ = fVar213 * fVar226;
    auVar28._16_4_ = fVar214 * 0.0;
    auVar28._20_4_ = fVar246 * 0.0;
    auVar28._24_4_ = fVar260 * 0.0;
    auVar28._28_4_ = 0;
    fVar284 = local_b40._0_4_;
    fVar290 = local_b40._4_4_;
    auVar29._4_4_ = fVar290 * fVar215 * fVar241;
    auVar29._0_4_ = fVar284 * fVar245 * fVar100;
    fVar291 = local_b40._8_4_;
    auVar29._8_4_ = fVar291 * fVar227 * fVar244;
    fVar293 = local_b40._12_4_;
    auVar29._12_4_ = fVar293 * fVar228 * fVar226;
    fVar294 = local_b40._16_4_;
    auVar29._16_4_ = fVar294 * fVar230 * 0.0;
    fVar295 = local_b40._20_4_;
    auVar29._20_4_ = fVar295 * fVar231 * 0.0;
    fVar296 = local_b40._24_4_;
    auVar29._24_4_ = fVar296 * fVar212 * 0.0;
    auVar29._28_4_ = auVar16._28_4_;
    auVar159 = vfmadd231ps_fma(auVar29,auVar28,_local_860);
    auVar299 = ZEXT1632(auVar103);
    auVar118 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar115 = vsubps_avx(auVar118,auVar299);
    fVar233 = auVar115._0_4_;
    fVar242 = auVar115._4_4_;
    auVar30._4_4_ = fVar215 * fVar241 * fVar242;
    auVar30._0_4_ = fVar245 * fVar100 * fVar233;
    fVar245 = auVar115._8_4_;
    auVar30._8_4_ = fVar227 * fVar244 * fVar245;
    fVar227 = auVar115._12_4_;
    auVar30._12_4_ = fVar228 * fVar226 * fVar227;
    fVar229 = auVar115._16_4_;
    auVar30._16_4_ = fVar230 * 0.0 * fVar229;
    fVar230 = auVar115._20_4_;
    auVar30._20_4_ = fVar231 * 0.0 * fVar230;
    fVar231 = auVar115._24_4_;
    auVar30._24_4_ = fVar212 * 0.0 * fVar231;
    auVar30._28_4_ = local_a60._28_4_;
    auVar118 = vsubps_avx(auVar118,auVar146);
    auVar103 = vfmadd231ps_fma(auVar30,auVar118,auVar28);
    auVar31._4_4_ = fVar262 * fVar241;
    auVar31._0_4_ = fVar261 * fVar100;
    auVar31._8_4_ = fVar279 * fVar244;
    auVar31._12_4_ = fVar280 * fVar226;
    auVar31._16_4_ = fVar281 * 0.0;
    auVar31._20_4_ = fVar282 * 0.0;
    auVar31._24_4_ = fVar283 * 0.0;
    auVar31._28_4_ = 0;
    auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar31,_local_880);
    auVar273 = ZEXT1664(auVar159);
    auVar119 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar255 = vsubps_avx(auVar119,auVar170);
    auVar278 = ZEXT3264(auVar255);
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar255,auVar31);
    auVar32._4_4_ = fVar290 * fVar242;
    auVar32._0_4_ = fVar284 * fVar233;
    auVar32._8_4_ = fVar291 * fVar245;
    auVar32._12_4_ = fVar293 * fVar227;
    auVar32._16_4_ = fVar294 * fVar229;
    auVar32._20_4_ = fVar295 * fVar230;
    auVar32._24_4_ = fVar296 * fVar231;
    auVar32._28_4_ = 0;
    auVar110 = vfmadd231ps_fma(auVar32,_local_860,auVar118);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),_local_880,auVar255);
    fVar201 = auVar103._0_4_;
    fVar246 = auVar159._0_4_;
    fVar243 = auVar103._4_4_;
    fVar260 = auVar159._4_4_;
    fVar215 = auVar103._8_4_;
    fVar261 = auVar159._8_4_;
    fVar228 = auVar103._12_4_;
    fVar262 = auVar159._12_4_;
    auVar33._28_4_ = auVar13._28_4_;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(fVar262 * fVar228,
                            CONCAT48(fVar261 * fVar215,CONCAT44(fVar260 * fVar243,fVar246 * fVar201)
                                    )));
    auVar17 = vsubps_avx(ZEXT1632(auVar110),auVar33);
    auVar34._4_4_ = fVar242 * fVar242;
    auVar34._0_4_ = fVar233 * fVar233;
    auVar34._8_4_ = fVar245 * fVar245;
    auVar34._12_4_ = fVar227 * fVar227;
    auVar34._16_4_ = fVar229 * fVar229;
    auVar34._20_4_ = fVar230 * fVar230;
    auVar34._24_4_ = fVar231 * fVar231;
    auVar34._28_4_ = auVar13._28_4_;
    auVar110 = vfmadd231ps_fma(auVar34,auVar118,auVar118);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar255,auVar255);
    auVar13 = vsubps_avx(ZEXT1632(auVar110),
                         ZEXT1632(CONCAT412(fVar228 * fVar228,
                                            CONCAT48(fVar215 * fVar215,
                                                     CONCAT44(fVar243 * fVar243,fVar201 * fVar201)))
                                 ));
    auVar115 = vsqrtps_avx(auVar114);
    fVar214 = auVar115._28_4_ + auVar179._28_4_;
    fVar201 = (auVar115._0_4_ + auVar179._0_4_) * 1.0000002;
    fVar243 = (auVar115._4_4_ + auVar179._4_4_) * 1.0000002;
    fVar215 = (auVar115._8_4_ + auVar179._8_4_) * 1.0000002;
    fVar228 = (auVar115._12_4_ + auVar179._12_4_) * 1.0000002;
    fVar212 = (auVar115._16_4_ + auVar179._16_4_) * 1.0000002;
    fVar292 = (auVar115._20_4_ + auVar179._20_4_) * 1.0000002;
    fVar213 = (auVar115._24_4_ + auVar179._24_4_) * 1.0000002;
    auVar35._4_4_ = fVar243 * fVar243;
    auVar35._0_4_ = fVar201 * fVar201;
    auVar35._8_4_ = fVar215 * fVar215;
    auVar35._12_4_ = fVar228 * fVar228;
    auVar35._16_4_ = fVar212 * fVar212;
    auVar35._20_4_ = fVar292 * fVar292;
    auVar35._24_4_ = fVar213 * fVar213;
    auVar35._28_4_ = fVar214;
    auVar250._0_4_ = auVar17._0_4_ + auVar17._0_4_;
    auVar250._4_4_ = auVar17._4_4_ + auVar17._4_4_;
    auVar250._8_4_ = auVar17._8_4_ + auVar17._8_4_;
    auVar250._12_4_ = auVar17._12_4_ + auVar17._12_4_;
    auVar250._16_4_ = auVar17._16_4_ + auVar17._16_4_;
    auVar250._20_4_ = auVar17._20_4_ + auVar17._20_4_;
    auVar250._24_4_ = auVar17._24_4_ + auVar17._24_4_;
    fVar201 = auVar17._28_4_;
    auVar250._28_4_ = fVar201 + fVar201;
    auVar179 = vsubps_avx(auVar13,auVar35);
    auVar240 = ZEXT3264(auVar179);
    auVar272 = ZEXT1632(auVar159);
    auVar36._28_4_ = fVar214;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(fVar262 * fVar262,
                            CONCAT48(fVar261 * fVar261,CONCAT44(fVar260 * fVar260,fVar246 * fVar246)
                                    )));
    local_680 = vsubps_avx(local_220,auVar36);
    auVar265 = ZEXT3264(local_680);
    auVar37._4_4_ = auVar250._4_4_ * auVar250._4_4_;
    auVar37._0_4_ = auVar250._0_4_ * auVar250._0_4_;
    auVar37._8_4_ = auVar250._8_4_ * auVar250._8_4_;
    auVar37._12_4_ = auVar250._12_4_ * auVar250._12_4_;
    auVar37._16_4_ = auVar250._16_4_ * auVar250._16_4_;
    auVar37._20_4_ = auVar250._20_4_ * auVar250._20_4_;
    auVar37._24_4_ = auVar250._24_4_ * auVar250._24_4_;
    auVar37._28_4_ = 0;
    fVar243 = local_680._0_4_;
    fVar215 = local_680._4_4_;
    fVar228 = local_680._8_4_;
    fStack_9b8 = fVar228 * 4.0;
    fVar212 = local_680._12_4_;
    fStack_9b4 = fVar212 * 4.0;
    fVar292 = local_680._16_4_;
    fStack_9b0 = fVar292 * 4.0;
    fVar213 = local_680._20_4_;
    fStack_9ac = fVar213 * 4.0;
    fVar214 = local_680._24_4_;
    fStack_9a8 = fVar214 * 4.0;
    uStack_9a4 = 0x40800000;
    auVar38._4_4_ = fVar215 * 4.0 * auVar179._4_4_;
    auVar38._0_4_ = fVar243 * 4.0 * auVar179._0_4_;
    auVar38._8_4_ = fStack_9b8 * auVar179._8_4_;
    auVar38._12_4_ = fStack_9b4 * auVar179._12_4_;
    auVar38._16_4_ = fStack_9b0 * auVar179._16_4_;
    auVar38._20_4_ = fStack_9ac * auVar179._20_4_;
    auVar38._24_4_ = fStack_9a8 * auVar179._24_4_;
    auVar38._28_4_ = fVar201;
    auVar17 = vsubps_avx(auVar37,auVar38);
    auVar114 = vcmpps_avx(auVar17,auVar119,5);
    auVar301 = ZEXT1632(auVar103);
    fVar201 = local_680._28_4_;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      auVar223._8_4_ = 0x7f800000;
      auVar223._0_8_ = 0x7f8000007f800000;
      auVar223._12_4_ = 0x7f800000;
      auVar223._16_4_ = 0x7f800000;
      auVar223._20_4_ = 0x7f800000;
      auVar223._24_4_ = 0x7f800000;
      auVar223._28_4_ = 0x7f800000;
      auVar197._8_4_ = 0xff800000;
      auVar197._0_8_ = 0xff800000ff800000;
      auVar197._12_4_ = 0xff800000;
      auVar197._16_4_ = 0xff800000;
      auVar197._20_4_ = 0xff800000;
      auVar197._24_4_ = 0xff800000;
      auVar197._28_4_ = 0xff800000;
    }
    else {
      auVar14 = vsqrtps_avx(auVar17);
      auVar285._0_4_ = fVar243 + fVar243;
      auVar285._4_4_ = fVar215 + fVar215;
      auVar285._8_4_ = fVar228 + fVar228;
      auVar285._12_4_ = fVar212 + fVar212;
      auVar285._16_4_ = fVar292 + fVar292;
      auVar285._20_4_ = fVar213 + fVar213;
      auVar285._24_4_ = fVar214 + fVar214;
      auVar285._28_4_ = fVar201 + fVar201;
      auVar210 = vrcpps_avx(auVar285);
      auVar119 = vcmpps_avx(auVar17,auVar119,5);
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = 0x3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar120._16_4_ = 0x3f800000;
      auVar120._20_4_ = 0x3f800000;
      auVar120._24_4_ = 0x3f800000;
      auVar120._28_4_ = 0x3f800000;
      auVar103 = vfnmadd213ps_fma(auVar285,auVar210,auVar120);
      auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar210,auVar210);
      auVar198._0_4_ = (uint)auVar250._0_4_ ^ local_aa0;
      auVar198._4_4_ = (uint)auVar250._4_4_ ^ uStack_a9c;
      auVar198._8_4_ = (uint)auVar250._8_4_ ^ uStack_a98;
      auVar198._12_4_ = (uint)auVar250._12_4_ ^ uStack_a94;
      auVar198._16_4_ = (uint)auVar250._16_4_ ^ (uint)fStack_a90;
      auVar198._20_4_ = (uint)auVar250._20_4_ ^ (uint)fStack_a8c;
      auVar198._24_4_ = (uint)auVar250._24_4_ ^ (uint)fStack_a88;
      auVar198._28_4_ = (uint)auVar250._28_4_ ^ uStack_a84;
      auVar17 = vsubps_avx(auVar198,auVar14);
      auVar39._4_4_ = auVar103._4_4_ * auVar17._4_4_;
      auVar39._0_4_ = auVar103._0_4_ * auVar17._0_4_;
      auVar39._8_4_ = auVar103._8_4_ * auVar17._8_4_;
      auVar39._12_4_ = auVar103._12_4_ * auVar17._12_4_;
      auVar39._16_4_ = auVar17._16_4_ * 0.0;
      auVar39._20_4_ = auVar17._20_4_ * 0.0;
      auVar39._24_4_ = auVar17._24_4_ * 0.0;
      auVar39._28_4_ = auVar17._28_4_;
      auVar17 = vsubps_avx(auVar14,auVar250);
      auVar40._4_4_ = auVar103._4_4_ * auVar17._4_4_;
      auVar40._0_4_ = auVar103._0_4_ * auVar17._0_4_;
      auVar40._8_4_ = auVar103._8_4_ * auVar17._8_4_;
      auVar40._12_4_ = auVar103._12_4_ * auVar17._12_4_;
      auVar40._16_4_ = auVar17._16_4_ * 0.0;
      auVar40._20_4_ = auVar17._20_4_ * 0.0;
      auVar40._24_4_ = auVar17._24_4_ * 0.0;
      auVar40._28_4_ = auVar17._28_4_;
      auVar103 = vfmadd213ps_fma(auVar272,auVar39,auVar301);
      local_280 = auVar103._0_4_ * fVar100;
      fStack_27c = auVar103._4_4_ * fVar241;
      fStack_278 = auVar103._8_4_ * fVar244;
      fStack_274 = auVar103._12_4_ * fVar226;
      uStack_270 = 0;
      uStack_26c = 0;
      uStack_268 = 0;
      uStack_264 = 0x3f800000;
      auVar60._4_4_ = uStack_8bc;
      auVar60._0_4_ = local_8c0;
      auVar60._8_4_ = uStack_8b8;
      auVar60._12_4_ = uStack_8b4;
      auVar60._16_4_ = uStack_8b0;
      auVar60._20_4_ = uStack_8ac;
      auVar60._24_4_ = uStack_8a8;
      auVar60._28_4_ = uStack_8a4;
      auVar17 = vandps_avx(auVar36,auVar60);
      auVar17 = vmaxps_avx(local_620,auVar17);
      auVar41._4_4_ = auVar17._4_4_ * 1.9073486e-06;
      auVar41._0_4_ = auVar17._0_4_ * 1.9073486e-06;
      auVar41._8_4_ = auVar17._8_4_ * 1.9073486e-06;
      auVar41._12_4_ = auVar17._12_4_ * 1.9073486e-06;
      auVar41._16_4_ = auVar17._16_4_ * 1.9073486e-06;
      auVar41._20_4_ = auVar17._20_4_ * 1.9073486e-06;
      auVar41._24_4_ = auVar17._24_4_ * 1.9073486e-06;
      auVar41._28_4_ = auVar17._28_4_;
      auVar17 = vandps_avx(local_680,auVar60);
      auVar17 = vcmpps_avx(auVar17,auVar41,1);
      auVar103 = vfmadd213ps_fma(auVar272,auVar40,auVar301);
      auVar121._8_4_ = 0x7f800000;
      auVar121._0_8_ = 0x7f8000007f800000;
      auVar121._12_4_ = 0x7f800000;
      auVar121._16_4_ = 0x7f800000;
      auVar121._20_4_ = 0x7f800000;
      auVar121._24_4_ = 0x7f800000;
      auVar121._28_4_ = 0x7f800000;
      auVar223 = vblendvps_avx(auVar121,auVar39,auVar119);
      local_2c0 = auVar103._0_4_ * fVar100;
      fStack_2bc = auVar103._4_4_ * fVar241;
      fStack_2b8 = auVar103._8_4_ * fVar244;
      fStack_2b4 = auVar103._12_4_ * fVar226;
      uStack_2b0 = 0;
      uStack_2ac = 0;
      uStack_2a8 = 0;
      uStack_2a4 = 0x7f800000;
      auVar122._8_4_ = 0xff800000;
      auVar122._0_8_ = 0xff800000ff800000;
      auVar122._12_4_ = 0xff800000;
      auVar122._16_4_ = 0xff800000;
      auVar122._20_4_ = 0xff800000;
      auVar122._24_4_ = 0xff800000;
      auVar122._28_4_ = 0xff800000;
      auVar197 = vblendvps_avx(auVar122,auVar40,auVar119);
      auVar210 = auVar119 & auVar17;
      if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar210 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar210 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar210 >> 0x7f,0) != '\0') ||
            (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar210 >> 0xbf,0) != '\0') ||
          (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar210[0x1f] < '\0') {
        auVar114 = vandps_avx(auVar17,auVar119);
        auVar17 = vcmpps_avx(auVar179,_DAT_01faff00,2);
        auVar240 = ZEXT3264(auVar17);
        auVar132._8_4_ = 0xff800000;
        auVar132._0_8_ = 0xff800000ff800000;
        auVar132._12_4_ = 0xff800000;
        auVar132._16_4_ = 0xff800000;
        auVar132._20_4_ = 0xff800000;
        auVar132._24_4_ = 0xff800000;
        auVar132._28_4_ = 0xff800000;
        auVar153._8_4_ = 0x7f800000;
        auVar153._0_8_ = 0x7f8000007f800000;
        auVar153._12_4_ = 0x7f800000;
        auVar153._16_4_ = 0x7f800000;
        auVar153._20_4_ = 0x7f800000;
        auVar153._24_4_ = 0x7f800000;
        auVar153._28_4_ = 0x7f800000;
        auVar179 = vblendvps_avx(auVar153,auVar132,auVar17);
        auVar103 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar210 = vpmovsxwd_avx2(auVar103);
        auVar223 = vblendvps_avx(auVar223,auVar179,auVar210);
        auVar179 = vblendvps_avx(auVar132,auVar153,auVar17);
        auVar197 = vblendvps_avx(auVar197,auVar179,auVar210);
        auVar211._0_8_ = auVar114._0_8_ ^ 0xffffffffffffffff;
        auVar211._8_4_ = auVar114._8_4_ ^ 0xffffffff;
        auVar211._12_4_ = auVar114._12_4_ ^ 0xffffffff;
        auVar211._16_4_ = auVar114._16_4_ ^ 0xffffffff;
        auVar211._20_4_ = auVar114._20_4_ ^ 0xffffffff;
        auVar211._24_4_ = auVar114._24_4_ ^ 0xffffffff;
        auVar211._28_4_ = auVar114._28_4_ ^ 0xffffffff;
        auVar114 = vorps_avx(auVar17,auVar211);
        auVar114 = vandps_avx(auVar119,auVar114);
      }
    }
    auVar289 = ZEXT3264(local_b40);
    auVar259 = ZEXT3264(auVar250);
    auVar179 = local_7e0 & auVar114;
    if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar179 >> 0x7f,0) != '\0') ||
          (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar179 >> 0xbf,0) != '\0') ||
        (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar179[0x1f] < '\0') {
      local_2a0 = ZEXT1632(auVar104);
      fVar246 = *(float *)(ray + k * 4 + 0x100);
      local_6d0 = ZEXT416((uint)fVar246);
      fVar260 = fVar246 - (float)local_920._0_4_;
      auVar209._4_4_ = fVar260;
      auVar209._0_4_ = fVar260;
      auVar209._8_4_ = fVar260;
      auVar209._12_4_ = fVar260;
      auVar209._16_4_ = fVar260;
      auVar209._20_4_ = fVar260;
      auVar209._24_4_ = fVar260;
      auVar209._28_4_ = fVar260;
      auVar119 = vminps_avx(auVar209,auVar197);
      auVar42._4_4_ = fVar242 * fVar302;
      auVar42._0_4_ = fVar233 * fVar300;
      auVar42._8_4_ = fVar245 * fVar303;
      auVar42._12_4_ = fVar227 * fVar304;
      auVar42._16_4_ = fVar229 * fVar305;
      auVar42._20_4_ = fVar230 * fVar306;
      auVar42._24_4_ = fVar231 * fVar307;
      auVar42._28_4_ = fVar260;
      auVar104 = vfmadd213ps_fma(auVar118,local_b20,auVar42);
      auVar86._4_4_ = fStack_25c;
      auVar86._0_4_ = local_260;
      auVar86._8_4_ = fStack_258;
      auVar86._12_4_ = fStack_254;
      auVar86._16_4_ = fStack_250;
      auVar86._20_4_ = fStack_24c;
      auVar86._24_4_ = fStack_248;
      auVar86._28_4_ = fStack_244;
      auVar17 = vmaxps_avx(auVar86,auVar223);
      auVar103 = vfmadd213ps_fma(auVar255,local_820,ZEXT1632(auVar104));
      auVar43._4_4_ = fVar290 * fVar302;
      auVar43._0_4_ = fVar284 * fVar300;
      auVar43._8_4_ = fVar291 * fVar303;
      auVar43._12_4_ = fVar293 * fVar304;
      auVar43._16_4_ = fVar294 * fVar305;
      auVar43._20_4_ = fVar295 * fVar306;
      auVar43._24_4_ = fVar296 * fVar307;
      auVar43._28_4_ = 0x3f000000;
      auVar104 = vfmadd231ps_fma(auVar43,_local_860,local_b20);
      auVar159 = vfmadd231ps_fma(ZEXT1632(auVar104),_local_880,local_820);
      auVar265 = ZEXT3264(auVar114);
      auVar61._4_4_ = uStack_8bc;
      auVar61._0_4_ = local_8c0;
      auVar61._8_4_ = uStack_8b8;
      auVar61._12_4_ = uStack_8b4;
      auVar61._16_4_ = uStack_8b0;
      auVar61._20_4_ = uStack_8ac;
      auVar61._24_4_ = uStack_8a8;
      auVar61._28_4_ = uStack_8a4;
      auVar179 = vandps_avx(auVar61,ZEXT1632(auVar159));
      auVar147._8_4_ = 0x219392ef;
      auVar147._0_8_ = 0x219392ef219392ef;
      auVar147._12_4_ = 0x219392ef;
      auVar147._16_4_ = 0x219392ef;
      auVar147._20_4_ = 0x219392ef;
      auVar147._24_4_ = 0x219392ef;
      auVar147._28_4_ = 0x219392ef;
      auVar118 = vcmpps_avx(auVar179,auVar147,1);
      auVar179 = vrcpps_avx(ZEXT1632(auVar159));
      auVar224._8_4_ = 0x3f800000;
      auVar224._0_8_ = 0x3f8000003f800000;
      auVar224._12_4_ = 0x3f800000;
      auVar224._16_4_ = 0x3f800000;
      auVar224._20_4_ = 0x3f800000;
      auVar224._24_4_ = 0x3f800000;
      auVar224._28_4_ = 0x3f800000;
      auVar210 = ZEXT1632(auVar159);
      auVar104 = vfnmadd213ps_fma(auVar179,auVar210,auVar224);
      auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar179,auVar179);
      auVar286._0_4_ = auVar159._0_4_ ^ local_aa0;
      auVar286._4_4_ = auVar159._4_4_ ^ uStack_a9c;
      auVar286._8_4_ = auVar159._8_4_ ^ uStack_a98;
      auVar286._12_4_ = auVar159._12_4_ ^ uStack_a94;
      auVar286._16_4_ = fStack_a90;
      auVar286._20_4_ = fStack_a8c;
      auVar286._24_4_ = fStack_a88;
      auVar286._28_4_ = uStack_a84;
      auVar44._4_4_ = auVar104._4_4_ * (float)(auVar103._4_4_ ^ uStack_a9c);
      auVar44._0_4_ = auVar104._0_4_ * (float)(auVar103._0_4_ ^ local_aa0);
      auVar44._8_4_ = auVar104._8_4_ * (float)(auVar103._8_4_ ^ uStack_a98);
      auVar44._12_4_ = auVar104._12_4_ * (float)(auVar103._12_4_ ^ uStack_a94);
      auVar44._16_4_ = fStack_a90 * 0.0;
      auVar44._20_4_ = fStack_a8c * 0.0;
      auVar44._24_4_ = fStack_a88 * 0.0;
      auVar44._28_4_ = uStack_a84;
      auVar179 = vcmpps_avx(auVar210,auVar286,1);
      auVar179 = vorps_avx(auVar118,auVar179);
      auVar275._8_4_ = 0xff800000;
      auVar275._0_8_ = 0xff800000ff800000;
      auVar275._12_4_ = 0xff800000;
      auVar275._16_4_ = 0xff800000;
      auVar275._20_4_ = 0xff800000;
      auVar275._24_4_ = 0xff800000;
      auVar275._28_4_ = 0xff800000;
      auVar179 = vblendvps_avx(auVar44,auVar275,auVar179);
      auVar255 = vmaxps_avx(auVar17,auVar179);
      auVar179 = vcmpps_avx(auVar210,auVar286,6);
      auVar179 = vorps_avx(auVar118,auVar179);
      auVar287._8_4_ = 0x7f800000;
      auVar287._0_8_ = 0x7f8000007f800000;
      auVar287._12_4_ = 0x7f800000;
      auVar287._16_4_ = 0x7f800000;
      auVar287._20_4_ = 0x7f800000;
      auVar287._24_4_ = 0x7f800000;
      auVar287._28_4_ = 0x7f800000;
      auVar179 = vblendvps_avx(auVar44,auVar287,auVar179);
      auVar17 = vminps_avx(auVar119,auVar179);
      auVar289 = ZEXT3264(auVar17);
      fVar233 = (float)(local_aa0 ^ (uint)local_a60._0_4_);
      fVar242 = (float)(uStack_a9c ^ (uint)local_a60._4_4_);
      fVar245 = (float)(uStack_a98 ^ (uint)local_a60._8_4_);
      fVar227 = (float)(uStack_a94 ^ (uint)local_a60._12_4_);
      fVar229 = (float)((uint)fStack_a90 ^ (uint)local_a60._16_4_);
      fVar230 = (float)((uint)fStack_a8c ^ (uint)local_a60._20_4_);
      fVar231 = (float)((uint)fStack_a88 ^ (uint)local_a60._24_4_);
      local_b60._28_4_ = auVar19._28_4_;
      auVar238._0_4_ = local_aa0 ^ (uint)auVar19._0_4_;
      auVar238._4_4_ = uStack_a9c ^ (uint)auVar19._4_4_;
      auVar238._8_4_ = uStack_a98 ^ (uint)auVar19._8_4_;
      auVar238._12_4_ = uStack_a94 ^ (uint)auVar19._12_4_;
      auVar238._16_4_ = (uint)fStack_a90 ^ (uint)auVar19._16_4_;
      auVar238._20_4_ = (uint)fStack_a8c ^ (uint)auVar19._20_4_;
      auVar238._24_4_ = (uint)fStack_a88 ^ (uint)auVar19._24_4_;
      auVar238._28_4_ = uStack_a84 ^ local_b60._28_4_;
      auVar118 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar179 = vsubps_avx(auVar118,_local_960);
      auVar118 = vsubps_avx(auVar118,local_b00);
      auVar45._4_4_ = auVar118._4_4_ * fVar242;
      auVar45._0_4_ = auVar118._0_4_ * fVar233;
      auVar45._8_4_ = auVar118._8_4_ * fVar245;
      auVar45._12_4_ = auVar118._12_4_ * fVar227;
      auVar45._16_4_ = auVar118._16_4_ * fVar229;
      auVar45._20_4_ = auVar118._20_4_ * fVar230;
      auVar45._24_4_ = auVar118._24_4_ * fVar231;
      auVar45._28_4_ = auVar118._28_4_;
      auVar104 = vfmadd231ps_fma(auVar45,auVar238,auVar179);
      auVar251._0_4_ = local_aa0 ^ (uint)local_a40._0_4_;
      auVar251._4_4_ = uStack_a9c ^ (uint)local_a40._4_4_;
      auVar251._8_4_ = uStack_a98 ^ (uint)local_a40._8_4_;
      auVar251._12_4_ = uStack_a94 ^ (uint)local_a40._12_4_;
      auVar251._16_4_ = (uint)fStack_a90 ^ (uint)local_a40._16_4_;
      auVar251._20_4_ = (uint)fStack_a8c ^ (uint)local_a40._20_4_;
      auVar251._24_4_ = (uint)fStack_a88 ^ (uint)local_a40._24_4_;
      auVar251._28_4_ = uStack_a84 ^ local_a40._28_4_;
      auVar179 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar18);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar251,auVar179);
      auVar46._4_4_ = fVar242 * fVar290;
      auVar46._0_4_ = fVar233 * fVar284;
      auVar46._8_4_ = fVar245 * fVar291;
      auVar46._12_4_ = fVar227 * fVar293;
      auVar46._16_4_ = fVar229 * fVar294;
      auVar46._20_4_ = fVar230 * fVar295;
      auVar46._24_4_ = fVar231 * fVar296;
      auVar46._28_4_ = uStack_a84 ^ local_a60._28_4_;
      auVar104 = vfmadd231ps_fma(auVar46,_local_860,auVar238);
      auVar159 = vfmadd231ps_fma(ZEXT1632(auVar104),_local_880,auVar251);
      auVar179 = vandps_avx(auVar61,ZEXT1632(auVar159));
      auVar119 = vrcpps_avx(ZEXT1632(auVar159));
      auVar172._8_4_ = 0x219392ef;
      auVar172._0_8_ = 0x219392ef219392ef;
      auVar172._12_4_ = 0x219392ef;
      auVar172._16_4_ = 0x219392ef;
      auVar172._20_4_ = 0x219392ef;
      auVar172._24_4_ = 0x219392ef;
      auVar172._28_4_ = 0x219392ef;
      auVar118 = vcmpps_avx(auVar179,auVar172,1);
      auVar240 = ZEXT3264(auVar118);
      auVar210 = ZEXT1632(auVar159);
      auVar104 = vfnmadd213ps_fma(auVar119,auVar210,auVar224);
      auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar119,auVar119);
      auVar252._0_4_ = auVar159._0_4_ ^ local_aa0;
      auVar252._4_4_ = auVar159._4_4_ ^ uStack_a9c;
      auVar252._8_4_ = auVar159._8_4_ ^ uStack_a98;
      auVar252._12_4_ = auVar159._12_4_ ^ uStack_a94;
      auVar252._16_4_ = fStack_a90;
      auVar252._20_4_ = fStack_a8c;
      auVar252._24_4_ = fStack_a88;
      auVar252._28_4_ = uStack_a84;
      auVar259 = ZEXT3264(auVar252);
      auVar47._4_4_ = auVar104._4_4_ * (float)(auVar103._4_4_ ^ uStack_a9c);
      auVar47._0_4_ = auVar104._0_4_ * (float)(auVar103._0_4_ ^ local_aa0);
      auVar47._8_4_ = auVar104._8_4_ * (float)(auVar103._8_4_ ^ uStack_a98);
      auVar47._12_4_ = auVar104._12_4_ * (float)(auVar103._12_4_ ^ uStack_a94);
      auVar47._16_4_ = fStack_a90 * 0.0;
      auVar47._20_4_ = fStack_a8c * 0.0;
      auVar47._24_4_ = fStack_a88 * 0.0;
      auVar47._28_4_ = uStack_a84;
      auVar179 = vcmpps_avx(auVar210,auVar252,1);
      auVar179 = vorps_avx(auVar179,auVar118);
      auVar148._8_4_ = 0xff800000;
      auVar148._0_8_ = 0xff800000ff800000;
      auVar148._12_4_ = 0xff800000;
      auVar148._16_4_ = 0xff800000;
      auVar148._20_4_ = 0xff800000;
      auVar148._24_4_ = 0xff800000;
      auVar148._28_4_ = 0xff800000;
      auVar179 = vblendvps_avx(auVar47,auVar148,auVar179);
      auVar278 = ZEXT3264(auVar179);
      local_9e0 = vmaxps_avx(auVar255,auVar179);
      auVar179 = vcmpps_avx(auVar210,auVar252,6);
      auVar179 = vorps_avx(auVar118,auVar179);
      auVar173._8_4_ = 0x7f800000;
      auVar173._0_8_ = 0x7f8000007f800000;
      auVar173._12_4_ = 0x7f800000;
      auVar173._16_4_ = 0x7f800000;
      auVar173._20_4_ = 0x7f800000;
      auVar173._24_4_ = 0x7f800000;
      auVar173._28_4_ = 0x7f800000;
      auVar179 = vblendvps_avx(auVar47,auVar173,auVar179);
      auVar114 = vandps_avx(auVar114,local_7e0);
      local_2e0 = vminps_avx(auVar17,auVar179);
      auVar179 = vcmpps_avx(local_9e0,local_2e0,2);
      auVar118 = auVar114 & auVar179;
      if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0x7f,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar118 >> 0xbf,0) != '\0') ||
          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar118[0x1f] < '\0') {
        auVar85._4_4_ = fStack_27c;
        auVar85._0_4_ = local_280;
        auVar85._8_4_ = fStack_278;
        auVar85._12_4_ = fStack_274;
        auVar85._16_4_ = uStack_270;
        auVar85._20_4_ = uStack_26c;
        auVar85._24_4_ = uStack_268;
        auVar85._28_4_ = uStack_264;
        auVar118 = vminps_avx(auVar85,auVar224);
        auVar59 = ZEXT812(0);
        auVar181 = ZEXT1264(auVar59) << 0x20;
        auVar118 = vmaxps_avx(auVar118,ZEXT1232(auVar59) << 0x20);
        auVar84._4_4_ = fStack_2bc;
        auVar84._0_4_ = local_2c0;
        auVar84._8_4_ = fStack_2b8;
        auVar84._12_4_ = fStack_2b4;
        auVar84._16_4_ = uStack_2b0;
        auVar84._20_4_ = uStack_2ac;
        auVar84._24_4_ = uStack_2a8;
        auVar84._28_4_ = uStack_2a4;
        auVar255 = vminps_avx(auVar84,auVar224);
        auVar255 = vmaxps_avx(auVar255,ZEXT1232(auVar59) << 0x20);
        auVar48._4_4_ = (auVar118._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar118._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar118._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar118._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar118._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar118._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar118._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar118._28_4_ + 7.0;
        auVar104 = vfmadd213ps_fma(auVar48,local_9a0,local_a80);
        auVar49._4_4_ = (auVar255._4_4_ + 1.0) * 0.125;
        auVar49._0_4_ = (auVar255._0_4_ + 0.0) * 0.125;
        auVar49._8_4_ = (auVar255._8_4_ + 2.0) * 0.125;
        auVar49._12_4_ = (auVar255._12_4_ + 3.0) * 0.125;
        auVar49._16_4_ = (auVar255._16_4_ + 4.0) * 0.125;
        auVar49._20_4_ = (auVar255._20_4_ + 5.0) * 0.125;
        auVar49._24_4_ = (auVar255._24_4_ + 6.0) * 0.125;
        auVar49._28_4_ = auVar255._28_4_ + 7.0;
        auVar103 = vfmadd213ps_fma(auVar49,local_9a0,local_a80);
        auVar118 = vminps_avx(auVar222,local_840);
        auVar255 = vminps_avx(auVar20,auVar21);
        auVar118 = vminps_avx(auVar118,auVar255);
        auVar115 = vsubps_avx(auVar118,auVar115);
        auVar114 = vandps_avx(auVar179,auVar114);
        local_1a0 = ZEXT1632(auVar104);
        local_1c0 = ZEXT1632(auVar103);
        auVar50._4_4_ = auVar115._4_4_ * 0.99999976;
        auVar50._0_4_ = auVar115._0_4_ * 0.99999976;
        auVar50._8_4_ = auVar115._8_4_ * 0.99999976;
        auVar50._12_4_ = auVar115._12_4_ * 0.99999976;
        auVar50._16_4_ = auVar115._16_4_ * 0.99999976;
        auVar50._20_4_ = auVar115._20_4_ * 0.99999976;
        auVar50._24_4_ = auVar115._24_4_ * 0.99999976;
        auVar50._28_4_ = auVar115._28_4_;
        auVar179 = vmaxps_avx(ZEXT832(0) << 0x20,auVar50);
        auVar51._4_4_ = auVar179._4_4_ * auVar179._4_4_;
        auVar51._0_4_ = auVar179._0_4_ * auVar179._0_4_;
        auVar51._8_4_ = auVar179._8_4_ * auVar179._8_4_;
        auVar51._12_4_ = auVar179._12_4_ * auVar179._12_4_;
        auVar51._16_4_ = auVar179._16_4_ * auVar179._16_4_;
        auVar51._20_4_ = auVar179._20_4_ * auVar179._20_4_;
        auVar51._24_4_ = auVar179._24_4_ * auVar179._24_4_;
        auVar51._28_4_ = auVar179._28_4_;
        auVar115 = vsubps_avx(auVar13,auVar51);
        auVar52._4_4_ = auVar115._4_4_ * fVar215 * 4.0;
        auVar52._0_4_ = auVar115._0_4_ * fVar243 * 4.0;
        auVar52._8_4_ = auVar115._8_4_ * fStack_9b8;
        auVar52._12_4_ = auVar115._12_4_ * fStack_9b4;
        auVar52._16_4_ = auVar115._16_4_ * fStack_9b0;
        auVar52._20_4_ = auVar115._20_4_ * fStack_9ac;
        auVar52._24_4_ = auVar115._24_4_ * fStack_9a8;
        auVar52._28_4_ = auVar179._28_4_;
        auVar13 = vsubps_avx(auVar37,auVar52);
        local_ae0 = vcmpps_avx(auVar13,ZEXT1232(auVar59) << 0x20,5);
        auVar179 = local_ae0;
        if ((((((((local_ae0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_ae0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_ae0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_ae0 >> 0x7f,0) == '\0') &&
              (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_ae0 >> 0xbf,0) == '\0') &&
            (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_ae0[0x1f]) {
          auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
          local_900 = ZEXT832(0) << 0x20;
          _local_800 = ZEXT832(0) << 0x20;
          auVar118 = ZEXT832(0) << 0x40;
          auVar239._8_4_ = 0x7f800000;
          auVar239._0_8_ = 0x7f8000007f800000;
          auVar239._12_4_ = 0x7f800000;
          auVar239._16_4_ = 0x7f800000;
          auVar239._20_4_ = 0x7f800000;
          auVar239._24_4_ = 0x7f800000;
          auVar239._28_4_ = 0x7f800000;
          auVar253._8_4_ = 0xff800000;
          auVar253._0_8_ = 0xff800000ff800000;
          auVar253._12_4_ = 0xff800000;
          auVar253._16_4_ = 0xff800000;
          auVar253._20_4_ = 0xff800000;
          auVar253._24_4_ = 0xff800000;
          auVar253._28_4_ = 0xff800000;
          auVar277 = local_9a0;
          local_ae0 = auVar18;
          local_8e0 = local_900;
        }
        else {
          auVar255 = vsqrtps_avx(auVar13);
          auVar254._0_4_ = fVar243 + fVar243;
          auVar254._4_4_ = fVar215 + fVar215;
          auVar254._8_4_ = fVar228 + fVar228;
          auVar254._12_4_ = fVar212 + fVar212;
          auVar254._16_4_ = fVar292 + fVar292;
          auVar254._20_4_ = fVar213 + fVar213;
          auVar254._24_4_ = fVar214 + fVar214;
          auVar254._28_4_ = fVar201 + fVar201;
          auVar118 = vrcpps_avx(auVar254);
          auVar104 = vfnmadd213ps_fma(auVar254,auVar118,auVar224);
          auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar118,auVar118);
          auVar276._0_4_ = (uint)auVar250._0_4_ ^ local_aa0;
          auVar276._4_4_ = (uint)auVar250._4_4_ ^ uStack_a9c;
          auVar276._8_4_ = (uint)auVar250._8_4_ ^ uStack_a98;
          auVar276._12_4_ = (uint)auVar250._12_4_ ^ uStack_a94;
          auVar276._16_4_ = (uint)auVar250._16_4_ ^ (uint)fStack_a90;
          auVar276._20_4_ = (uint)auVar250._20_4_ ^ (uint)fStack_a8c;
          auVar276._24_4_ = (uint)auVar250._24_4_ ^ (uint)fStack_a88;
          auVar276._28_4_ = (uint)auVar250._28_4_ ^ uStack_a84;
          auVar118 = vsubps_avx(auVar276,auVar255);
          auVar17 = vsubps_avx(auVar255,auVar250);
          fVar233 = auVar118._0_4_ * auVar104._0_4_;
          fVar242 = auVar118._4_4_ * auVar104._4_4_;
          auVar53._4_4_ = fVar242;
          auVar53._0_4_ = fVar233;
          fVar243 = auVar118._8_4_ * auVar104._8_4_;
          auVar53._8_4_ = fVar243;
          fVar245 = auVar118._12_4_ * auVar104._12_4_;
          auVar53._12_4_ = fVar245;
          fVar215 = auVar118._16_4_ * 0.0;
          auVar53._16_4_ = fVar215;
          fVar227 = auVar118._20_4_ * 0.0;
          auVar53._20_4_ = fVar227;
          fVar228 = auVar118._24_4_ * 0.0;
          auVar53._24_4_ = fVar228;
          auVar53._28_4_ = auVar255._28_4_;
          fVar229 = auVar104._0_4_ * auVar17._0_4_;
          fVar230 = auVar104._4_4_ * auVar17._4_4_;
          auVar277._4_4_ = fVar230;
          auVar277._0_4_ = fVar229;
          fVar231 = auVar104._8_4_ * auVar17._8_4_;
          auVar277._8_4_ = fVar231;
          fVar212 = auVar104._12_4_ * auVar17._12_4_;
          auVar277._12_4_ = fVar212;
          fVar292 = auVar17._16_4_ * 0.0;
          auVar277._16_4_ = fVar292;
          fVar213 = auVar17._20_4_ * 0.0;
          auVar277._20_4_ = fVar213;
          fVar214 = auVar17._24_4_ * 0.0;
          auVar277._24_4_ = fVar214;
          auVar277._28_4_ = auVar118._28_4_;
          auVar104 = vfmadd213ps_fma(auVar272,auVar53,auVar301);
          auVar103 = vfmadd213ps_fma(auVar272,auVar277,auVar301);
          auVar255 = ZEXT1632(CONCAT412(fVar226 * auVar104._12_4_,
                                        CONCAT48(fVar244 * auVar104._8_4_,
                                                 CONCAT44(fVar241 * auVar104._4_4_,
                                                          fVar100 * auVar104._0_4_))));
          auVar118 = ZEXT1632(CONCAT412(fVar226 * auVar103._12_4_,
                                        CONCAT48(fVar244 * auVar103._8_4_,
                                                 CONCAT44(fVar241 * auVar103._4_4_,
                                                          fVar100 * auVar103._0_4_))));
          auVar104 = vfmadd213ps_fma(auVar15,auVar255,auVar170);
          auVar103 = vfmadd213ps_fma(auVar15,auVar118,auVar170);
          auVar159 = vfmadd213ps_fma(auVar16,auVar255,auVar146);
          auVar110 = vfmadd213ps_fma(auVar16,auVar118,auVar146);
          auVar102 = vfmadd213ps_fma(auVar255,auVar123,auVar299);
          auVar135 = vfmadd213ps_fma(auVar123,auVar118,auVar299);
          auVar54._4_4_ = (float)local_880._4_4_ * fVar242;
          auVar54._0_4_ = (float)local_880._0_4_ * fVar233;
          auVar54._8_4_ = fStack_878 * fVar243;
          auVar54._12_4_ = fStack_874 * fVar245;
          auVar54._16_4_ = fStack_870 * fVar215;
          auVar54._20_4_ = fStack_86c * fVar227;
          auVar54._24_4_ = fStack_868 * fVar228;
          auVar54._28_4_ = 0;
          auVar123 = vsubps_avx(auVar54,ZEXT1632(auVar104));
          auVar55._4_4_ = (float)local_860._4_4_ * fVar242;
          auVar55._0_4_ = (float)local_860._0_4_ * fVar233;
          auVar55._8_4_ = fStack_858 * fVar243;
          auVar55._12_4_ = fStack_854 * fVar245;
          auVar55._16_4_ = fStack_850 * fVar215;
          auVar55._20_4_ = fStack_84c * fVar227;
          auVar55._24_4_ = fStack_848 * fVar228;
          auVar55._28_4_ = fVar201;
          auVar118 = vsubps_avx(auVar55,ZEXT1632(auVar159));
          auVar174._0_4_ = fVar284 * fVar233;
          auVar174._4_4_ = fVar290 * fVar242;
          auVar174._8_4_ = fVar291 * fVar243;
          auVar174._12_4_ = fVar293 * fVar245;
          auVar174._16_4_ = fVar294 * fVar215;
          auVar174._20_4_ = fVar295 * fVar227;
          auVar174._24_4_ = fVar296 * fVar228;
          auVar174._28_4_ = 0;
          auVar15 = vsubps_avx(auVar174,ZEXT1632(auVar102));
          auVar181 = ZEXT3264(auVar15);
          auVar256._0_4_ = (float)local_880._0_4_ * fVar229;
          auVar256._4_4_ = (float)local_880._4_4_ * fVar230;
          auVar256._8_4_ = fStack_878 * fVar231;
          auVar256._12_4_ = fStack_874 * fVar212;
          auVar256._16_4_ = fStack_870 * fVar292;
          auVar256._20_4_ = fStack_86c * fVar213;
          auVar256._24_4_ = fStack_868 * fVar214;
          auVar256._28_4_ = 0;
          local_8e0 = vsubps_avx(auVar256,ZEXT1632(auVar103));
          auVar56._4_4_ = (float)local_860._4_4_ * fVar230;
          auVar56._0_4_ = (float)local_860._0_4_ * fVar229;
          auVar56._8_4_ = fStack_858 * fVar231;
          auVar56._12_4_ = fStack_854 * fVar212;
          auVar56._16_4_ = fStack_850 * fVar292;
          auVar56._20_4_ = fStack_84c * fVar213;
          auVar56._24_4_ = fStack_848 * fVar214;
          auVar56._28_4_ = local_8e0._28_4_;
          local_900 = vsubps_avx(auVar56,ZEXT1632(auVar110));
          auVar57._4_4_ = fVar290 * fVar230;
          auVar57._0_4_ = fVar284 * fVar229;
          auVar57._8_4_ = fVar291 * fVar231;
          auVar57._12_4_ = fVar293 * fVar212;
          auVar57._16_4_ = fVar294 * fVar292;
          auVar57._20_4_ = fVar295 * fVar213;
          auVar57._24_4_ = fVar296 * fVar214;
          auVar57._28_4_ = local_900._28_4_;
          _local_800 = vsubps_avx(auVar57,ZEXT1632(auVar135));
          auVar273 = ZEXT864(0) << 0x20;
          auVar15 = vcmpps_avx(auVar13,_DAT_01faff00,5);
          auVar257._8_4_ = 0x7f800000;
          auVar257._0_8_ = 0x7f8000007f800000;
          auVar257._12_4_ = 0x7f800000;
          auVar257._16_4_ = 0x7f800000;
          auVar257._20_4_ = 0x7f800000;
          auVar257._24_4_ = 0x7f800000;
          auVar257._28_4_ = 0x7f800000;
          auVar239 = vblendvps_avx(auVar257,auVar53,auVar15);
          auVar62._4_4_ = uStack_8bc;
          auVar62._0_4_ = local_8c0;
          auVar62._8_4_ = uStack_8b8;
          auVar62._12_4_ = uStack_8b4;
          auVar62._16_4_ = uStack_8b0;
          auVar62._20_4_ = uStack_8ac;
          auVar62._24_4_ = uStack_8a8;
          auVar62._28_4_ = uStack_8a4;
          auVar13 = vandps_avx(auVar62,auVar36);
          auVar13 = vmaxps_avx(local_620,auVar13);
          auVar58._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar58._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar58._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar58._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar58._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar58._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar58._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar58._28_4_ = auVar13._28_4_;
          auVar13 = vandps_avx(auVar62,local_680);
          auVar13 = vcmpps_avx(auVar13,auVar58,1);
          auVar258._8_4_ = 0xff800000;
          auVar258._0_8_ = 0xff800000ff800000;
          auVar258._12_4_ = 0xff800000;
          auVar258._16_4_ = 0xff800000;
          auVar258._20_4_ = 0xff800000;
          auVar258._24_4_ = 0xff800000;
          auVar258._28_4_ = 0xff800000;
          auVar253 = vblendvps_avx(auVar258,auVar277,auVar15);
          auVar255 = auVar15 & auVar13;
          if ((((((((auVar255 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar255 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar255 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar255 >> 0x7f,0) != '\0') ||
                (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar255 >> 0xbf,0) != '\0') ||
              (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar255[0x1f] < '\0') {
            auVar179 = vandps_avx(auVar13,auVar15);
            auVar13 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,2);
            auVar277._8_4_ = 0xff800000;
            auVar277._0_8_ = 0xff800000ff800000;
            auVar277._12_4_ = 0xff800000;
            auVar277._16_4_ = 0xff800000;
            auVar277._20_4_ = 0xff800000;
            auVar277._24_4_ = 0xff800000;
            auVar277._28_4_ = 0xff800000;
            auVar288._8_4_ = 0x7f800000;
            auVar288._0_8_ = 0x7f8000007f800000;
            auVar288._12_4_ = 0x7f800000;
            auVar288._16_4_ = 0x7f800000;
            auVar288._20_4_ = 0x7f800000;
            auVar288._24_4_ = 0x7f800000;
            auVar288._28_4_ = 0x7f800000;
            auVar115 = vblendvps_avx(auVar288,auVar277,auVar13);
            auVar104 = vpackssdw_avx(auVar179._0_16_,auVar179._16_16_);
            auVar255 = vpmovsxwd_avx2(auVar104);
            auVar239 = vblendvps_avx(auVar239,auVar115,auVar255);
            auVar115 = vblendvps_avx(auVar277,auVar288,auVar13);
            auVar273 = ZEXT3264(auVar115);
            auVar253 = vblendvps_avx(auVar253,auVar115,auVar255);
            auVar225._0_8_ = auVar179._0_8_ ^ 0xffffffffffffffff;
            auVar225._8_4_ = auVar179._8_4_ ^ 0xffffffff;
            auVar225._12_4_ = auVar179._12_4_ ^ 0xffffffff;
            auVar225._16_4_ = auVar179._16_4_ ^ 0xffffffff;
            auVar225._20_4_ = auVar179._20_4_ ^ 0xffffffff;
            auVar225._24_4_ = auVar179._24_4_ ^ 0xffffffff;
            auVar225._28_4_ = auVar179._28_4_ ^ 0xffffffff;
            auVar179 = vorps_avx(auVar13,auVar225);
            auVar179 = vandps_avx(auVar15,auVar179);
          }
        }
        auVar278 = ZEXT3264(auVar277);
        auVar289 = ZEXT3264(local_b40);
        auVar265 = ZEXT3264(local_9e0);
        local_460 = local_9e0;
        local_440 = vminps_avx(local_2e0,auVar239);
        local_b60 = vmaxps_avx(local_9e0,auVar253);
        auVar259 = ZEXT3264(local_b60);
        local_300 = local_b60;
        auVar115 = vcmpps_avx(local_9e0,local_440,2);
        local_740 = vandps_avx(auVar115,auVar114);
        auVar115 = vcmpps_avx(local_b60,local_2e0,2);
        local_7c0 = vandps_avx(auVar115,auVar114);
        auVar240 = ZEXT3264(local_7c0);
        auVar114 = vorps_avx(local_7c0,local_740);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          local_780._0_8_ = auVar179._0_8_ ^ 0xffffffffffffffff;
          local_780._8_4_ = auVar179._8_4_ ^ 0xffffffff;
          local_780._12_4_ = auVar179._12_4_ ^ 0xffffffff;
          local_780._16_4_ = auVar179._16_4_ ^ 0xffffffff;
          local_780._20_4_ = auVar179._20_4_ ^ 0xffffffff;
          local_780._24_4_ = auVar179._24_4_ ^ 0xffffffff;
          local_780._28_4_ = auVar179._28_4_ ^ 0xffffffff;
          auVar182._0_4_ = fVar284 * auVar181._0_4_;
          auVar182._4_4_ = fVar290 * auVar181._4_4_;
          auVar182._8_4_ = fVar291 * auVar181._8_4_;
          auVar182._12_4_ = fVar293 * auVar181._12_4_;
          auVar182._16_4_ = fVar294 * auVar181._16_4_;
          auVar182._20_4_ = fVar295 * auVar181._20_4_;
          auVar182._28_36_ = auVar181._28_36_;
          auVar182._24_4_ = fVar296 * auVar181._24_4_;
          auVar104 = vfmadd213ps_fma(auVar118,_local_860,auVar182._0_32_);
          auVar104 = vfmadd213ps_fma(auVar123,_local_880,ZEXT1632(auVar104));
          auVar63._4_4_ = uStack_8bc;
          auVar63._0_4_ = local_8c0;
          auVar63._8_4_ = uStack_8b8;
          auVar63._12_4_ = uStack_8b4;
          auVar63._16_4_ = uStack_8b0;
          auVar63._20_4_ = uStack_8ac;
          auVar63._24_4_ = uStack_8a8;
          auVar63._28_4_ = uStack_8a4;
          auVar114 = vandps_avx(ZEXT1632(auVar104),auVar63);
          auVar151._8_4_ = 0x3e99999a;
          auVar151._0_8_ = 0x3e99999a3e99999a;
          auVar151._12_4_ = 0x3e99999a;
          auVar151._16_4_ = 0x3e99999a;
          auVar151._20_4_ = 0x3e99999a;
          auVar151._24_4_ = 0x3e99999a;
          auVar151._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar151,1);
          auVar114 = vorps_avx(auVar114,local_780);
          auVar152._8_4_ = 3;
          auVar152._0_8_ = 0x300000003;
          auVar152._12_4_ = 3;
          auVar152._16_4_ = 3;
          auVar152._20_4_ = 3;
          auVar152._24_4_ = 3;
          auVar152._28_4_ = 3;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar175,auVar152,auVar114);
          local_7a0._4_4_ = local_cc8;
          local_7a0._0_4_ = local_cc8;
          local_7a0._8_4_ = local_cc8;
          local_7a0._12_4_ = local_cc8;
          local_7a0._16_4_ = local_cc8;
          local_7a0._20_4_ = local_cc8;
          local_7a0._24_4_ = local_cc8;
          local_7a0._28_4_ = local_cc8;
          local_760 = vpcmpgtd_avx2(auVar114,local_7a0);
          local_700 = vpandn_avx2(local_760,local_740);
          auVar181 = ZEXT3264(local_700);
          auVar114 = local_740 & ~local_760;
          fStack_bcc = auVar9._4_4_;
          fStack_bc8 = auVar9._8_4_;
          fStack_bc4 = auVar9._12_4_;
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar114 >> 0x7f,0) == '\0') &&
                (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0xbf,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar114[0x1f]) {
            auVar127._4_4_ = fVar246;
            auVar127._0_4_ = fVar246;
            auVar127._8_4_ = fVar246;
            auVar127._12_4_ = fVar246;
            auVar127._16_4_ = fVar246;
            auVar127._20_4_ = fVar246;
            auVar127._24_4_ = fVar246;
            auVar127._28_4_ = fVar246;
            local_b60 = auVar19;
            local_7c0 = auVar16;
            local_840._16_16_ = local_840._16_16_;
          }
          else {
            auVar103 = vminps_avx(auVar10,auVar12);
            auVar104 = vmaxps_avx(auVar10,auVar12);
            auVar159 = vminps_avx(auVar11,auVar9);
            auVar110 = vminps_avx(auVar103,auVar159);
            auVar103 = vmaxps_avx(auVar11,auVar9);
            auVar159 = vmaxps_avx(auVar104,auVar103);
            auVar104 = vandps_avx(auVar110,auVar234);
            auVar103 = vandps_avx(auVar159,auVar234);
            auVar104 = vmaxps_avx(auVar104,auVar103);
            auVar103 = vmovshdup_avx(auVar104);
            auVar103 = vmaxss_avx(auVar103,auVar104);
            auVar104 = vshufpd_avx(auVar104,auVar104,1);
            auVar104 = vmaxss_avx(auVar104,auVar103);
            local_ae0._0_4_ = auVar104._0_4_ * 1.9073486e-06;
            local_a00._0_16_ = vshufps_avx(auVar159,auVar159,0xff);
            local_a00._16_16_ = auVar20._16_16_;
            local_8a0._4_4_ = local_9e0._4_4_ + (float)local_980._4_4_;
            local_8a0._0_4_ = local_9e0._0_4_ + (float)local_980._0_4_;
            fStack_898 = local_9e0._8_4_ + fStack_978;
            fStack_894 = local_9e0._12_4_ + fStack_974;
            fStack_890 = local_9e0._16_4_ + fStack_970;
            fStack_88c = local_9e0._20_4_ + fStack_96c;
            fStack_888 = local_9e0._24_4_ + fStack_968;
            fStack_884 = local_9e0._28_4_ + fStack_964;
            do {
              auVar128._8_4_ = 0x7f800000;
              auVar128._0_8_ = 0x7f8000007f800000;
              auVar128._12_4_ = 0x7f800000;
              auVar128._16_4_ = 0x7f800000;
              auVar128._20_4_ = 0x7f800000;
              auVar128._24_4_ = 0x7f800000;
              auVar128._28_4_ = 0x7f800000;
              auVar114 = auVar181._0_32_;
              auVar179 = vblendvps_avx(auVar128,local_9e0,auVar114);
              auVar115 = vshufps_avx(auVar179,auVar179,0xb1);
              auVar115 = vminps_avx(auVar179,auVar115);
              auVar13 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar13);
              auVar13 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar13);
              auVar179 = vcmpps_avx(auVar179,auVar115,0);
              auVar115 = auVar114 & auVar179;
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0x7f,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0xbf,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar115[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar179,auVar114);
              }
              uVar92 = vmovmskps_avx(auVar114);
              iVar22 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                iVar22 = iVar22 + 1;
              }
              uVar93 = iVar22 << 2;
              *(undefined4 *)(local_700 + uVar93) = 0;
              uVar92 = *(uint *)(local_1a0 + uVar93);
              uVar93 = *(uint *)(local_460 + uVar93);
              fVar201 = auVar7._0_4_;
              if ((float)local_a20._0_4_ < 0.0) {
                fVar201 = sqrtf((float)local_a20._0_4_);
              }
              local_a60._0_4_ = fVar201 * 1.9073486e-06;
              auVar104 = vinsertps_avx(ZEXT416(uVar93),ZEXT416(uVar92),0x10);
              auVar265 = ZEXT1664(auVar104);
              lVar94 = 5;
              do {
                fVar243 = auVar265._0_4_;
                auVar106._4_4_ = fVar243;
                auVar106._0_4_ = fVar243;
                auVar106._8_4_ = fVar243;
                auVar106._12_4_ = fVar243;
                auVar103 = vfmadd213ps_fma(auVar106,local_a10,_DAT_01f7aa10);
                local_b00._0_16_ = vmovshdup_avx(auVar265._0_16_);
                fVar244 = local_b00._0_4_;
                fVar242 = 1.0 - fVar244;
                auVar135 = SUB6416(ZEXT464(0x40400000),0);
                auVar102 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar159 = vfmadd213ss_fma(auVar135,local_b00._0_16_,auVar102);
                auVar104 = vfmadd213ss_fma(auVar159,ZEXT416((uint)(fVar244 * fVar244)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar110 = vfmadd213ss_fma(auVar135,ZEXT416((uint)fVar242),auVar102);
                auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)(fVar242 * fVar242)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar201 = fVar242 * fVar242 * -fVar244 * 0.5;
                fVar100 = auVar104._0_4_ * 0.5;
                fVar233 = auVar110._0_4_ * 0.5;
                fVar241 = fVar244 * fVar244 * -fVar242 * 0.5;
                auVar184._0_4_ = fVar241 * fVar133;
                auVar184._4_4_ = fVar241 * fStack_bcc;
                auVar184._8_4_ = fVar241 * fStack_bc8;
                auVar184._12_4_ = fVar241 * fStack_bc4;
                auVar203._4_4_ = fVar233;
                auVar203._0_4_ = fVar233;
                auVar203._8_4_ = fVar233;
                auVar203._12_4_ = fVar233;
                auVar104 = vfmadd132ps_fma(auVar203,auVar184,auVar11);
                auVar155._4_4_ = fVar100;
                auVar155._0_4_ = fVar100;
                auVar155._8_4_ = fVar100;
                auVar155._12_4_ = fVar100;
                auVar104 = vfmadd132ps_fma(auVar155,auVar104,auVar12);
                auVar185._4_4_ = fVar201;
                auVar185._0_4_ = fVar201;
                auVar185._8_4_ = fVar201;
                auVar185._12_4_ = fVar201;
                auVar104 = vfmadd132ps_fma(auVar185,auVar104,auVar10);
                auVar102 = vfmadd231ss_fma(auVar102,local_b00._0_16_,ZEXT416(0x41100000));
                auVar110 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_b00._0_16_,
                                           ZEXT416(0x40800000));
                local_b20._0_16_ = auVar110;
                local_820._0_16_ = auVar104;
                auVar104 = vsubps_avx(auVar103,auVar104);
                _local_960 = auVar104;
                auVar104 = vdpps_avx(auVar104,auVar104,0x7f);
                auVar103 = vfmadd213ss_fma(auVar135,local_b00._0_16_,ZEXT416(0xbf800000));
                fVar201 = auVar104._0_4_;
                if (fVar201 < 0.0) {
                  local_a40._0_4_ = auVar159._0_4_;
                  local_a80._0_16_ = auVar102;
                  local_9a0._0_4_ = fVar242 * -2.0;
                  auVar289._0_4_ = sqrtf(fVar201);
                  auVar289._4_60_ = extraout_var;
                  auVar159 = ZEXT416((uint)local_a40._0_4_);
                  auVar110 = auVar289._0_16_;
                  fVar100 = (float)local_9a0._0_4_;
                  auVar102 = local_a80._0_16_;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar104,auVar104);
                  fVar100 = fVar242 * -2.0;
                }
                fVar233 = local_b00._0_4_;
                auVar135 = vfmadd213ss_fma(auVar159,ZEXT416((uint)(fVar233 + fVar233)),
                                           ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
                auVar101 = SUB6416(ZEXT464(0x40000000),0);
                auVar159 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_b00._0_16_,auVar101)
                ;
                auVar183 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar242 * -3.0)),
                                           ZEXT416((uint)(fVar242 + fVar242)),auVar159);
                auVar166 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar242 + fVar242))),
                                            ZEXT416((uint)fVar242),ZEXT416((uint)fVar242));
                auVar159 = vfmadd213ss_fma(ZEXT416((uint)fVar100),local_b00._0_16_,
                                           ZEXT416((uint)(fVar244 * fVar244)));
                fVar100 = auVar183._0_4_ * 0.5;
                fVar233 = auVar159._0_4_ * 0.5;
                auVar156._0_4_ = fVar133 * fVar233;
                auVar156._4_4_ = fStack_bcc * fVar233;
                auVar156._8_4_ = fStack_bc8 * fVar233;
                auVar156._12_4_ = fStack_bc4 * fVar233;
                auVar136._4_4_ = fVar100;
                auVar136._0_4_ = fVar100;
                auVar136._8_4_ = fVar100;
                auVar136._12_4_ = fVar100;
                auVar159 = vfmadd213ps_fma(auVar136,auVar11,auVar156);
                fVar100 = auVar166._0_4_ * 0.5;
                fVar233 = auVar135._0_4_ * 0.5;
                auVar157._4_4_ = fVar233;
                auVar157._0_4_ = fVar233;
                auVar157._8_4_ = fVar233;
                auVar157._12_4_ = fVar233;
                auVar159 = vfmadd213ps_fma(auVar157,auVar12,auVar159);
                auVar268._4_4_ = fVar100;
                auVar268._0_4_ = fVar100;
                auVar268._8_4_ = fVar100;
                auVar268._12_4_ = fVar100;
                auVar135 = vfmadd213ps_fma(auVar268,auVar10,auVar159);
                auVar183 = vfmadd213ss_fma(local_b00._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar101)
                ;
                local_c00 = auVar103._0_4_;
                auVar107._0_4_ = fVar133 * local_c00;
                auVar107._4_4_ = fStack_bcc * local_c00;
                auVar107._8_4_ = fStack_bc8 * local_c00;
                auVar107._12_4_ = fStack_bc4 * local_c00;
                auVar137._4_4_ = local_b20._0_4_;
                auVar137._0_4_ = local_b20._0_4_;
                auVar137._8_4_ = local_b20._0_4_;
                auVar137._12_4_ = local_b20._0_4_;
                auVar103 = vfmadd213ps_fma(auVar137,auVar11,auVar107);
                uVar99 = auVar102._0_4_;
                auVar158._4_4_ = uVar99;
                auVar158._0_4_ = uVar99;
                auVar158._8_4_ = uVar99;
                auVar158._12_4_ = uVar99;
                auVar103 = vfmadd213ps_fma(auVar158,auVar12,auVar103);
                auVar159 = vdpps_avx(auVar135,auVar135,0x7f);
                uVar99 = auVar183._0_4_;
                auVar138._4_4_ = uVar99;
                auVar138._0_4_ = uVar99;
                auVar138._8_4_ = uVar99;
                auVar138._12_4_ = uVar99;
                auVar183 = vfmadd213ps_fma(auVar138,auVar10,auVar103);
                auVar103 = vblendps_avx(auVar159,_DAT_01f7aa10,0xe);
                auVar102 = vrsqrtss_avx(auVar103,auVar103);
                fVar241 = auVar159._0_4_;
                fVar100 = auVar102._0_4_;
                auVar102 = vdpps_avx(auVar135,auVar183,0x7f);
                fVar100 = fVar100 * 1.5 + fVar241 * -0.5 * fVar100 * fVar100 * fVar100;
                auVar139._0_4_ = auVar183._0_4_ * fVar241;
                auVar139._4_4_ = auVar183._4_4_ * fVar241;
                auVar139._8_4_ = auVar183._8_4_ * fVar241;
                auVar139._12_4_ = auVar183._12_4_ * fVar241;
                fVar233 = auVar102._0_4_;
                auVar220._0_4_ = auVar135._0_4_ * fVar233;
                auVar220._4_4_ = auVar135._4_4_ * fVar233;
                fVar242 = auVar135._8_4_;
                auVar220._8_4_ = fVar242 * fVar233;
                fVar244 = auVar135._12_4_;
                auVar220._12_4_ = fVar244 * fVar233;
                auVar102 = vsubps_avx(auVar139,auVar220);
                auVar103 = vrcpss_avx(auVar103,auVar103);
                auVar183 = vfnmadd213ss_fma(auVar103,auVar159,auVar101);
                fVar233 = auVar103._0_4_ * auVar183._0_4_;
                auVar103 = vmaxss_avx(ZEXT416((uint)local_ae0._0_4_),
                                      ZEXT416((uint)(fVar243 * (float)local_a60._0_4_)));
                auVar278 = ZEXT1664(auVar103);
                local_a40._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
                local_a40._8_4_ = -fVar242;
                local_a40._12_4_ = -fVar244;
                auVar186._0_4_ = fVar100 * auVar102._0_4_ * fVar233;
                auVar186._4_4_ = fVar100 * auVar102._4_4_ * fVar233;
                auVar186._8_4_ = fVar100 * auVar102._8_4_ * fVar233;
                auVar186._12_4_ = fVar100 * auVar102._12_4_ * fVar233;
                auVar236._0_4_ = auVar135._0_4_ * fVar100;
                auVar236._4_4_ = auVar135._4_4_ * fVar100;
                auVar236._8_4_ = fVar242 * fVar100;
                auVar236._12_4_ = fVar244 * fVar100;
                local_b00._0_16_ = auVar135;
                local_b20._0_4_ = auVar103._0_4_;
                if (fVar241 < -fVar241) {
                  fVar100 = sqrtf(fVar241);
                  auVar278 = ZEXT464((uint)local_b20._0_4_);
                  auVar110 = ZEXT416(auVar110._0_4_);
                }
                else {
                  auVar103 = vsqrtss_avx(auVar159,auVar159);
                  fVar100 = auVar103._0_4_;
                }
                auVar103 = vdpps_avx(_local_960,auVar236,0x7f);
                auVar183 = vfmadd213ss_fma(ZEXT416((uint)local_ae0._0_4_),auVar110,auVar278._0_16_);
                auVar159 = vdpps_avx(local_a40._0_16_,auVar236,0x7f);
                auVar102 = vdpps_avx(_local_960,auVar186,0x7f);
                auVar135 = vdpps_avx(local_a10,auVar236,0x7f);
                auVar183 = vfmadd213ss_fma(ZEXT416((uint)(auVar110._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_ae0._0_4_ / fVar100)),
                                           auVar183);
                auVar273 = ZEXT1664(auVar183);
                fVar100 = auVar159._0_4_ + auVar102._0_4_;
                fVar241 = auVar103._0_4_;
                auVar108._0_4_ = fVar241 * fVar241;
                auVar108._4_4_ = auVar103._4_4_ * auVar103._4_4_;
                auVar108._8_4_ = auVar103._8_4_ * auVar103._8_4_;
                auVar108._12_4_ = auVar103._12_4_ * auVar103._12_4_;
                auVar159 = vdpps_avx(_local_960,local_a40._0_16_,0x7f);
                auVar102 = vsubps_avx(auVar104,auVar108);
                auVar110 = vrsqrtss_avx(auVar102,auVar102);
                fVar242 = auVar102._0_4_;
                fVar233 = auVar110._0_4_;
                fVar233 = fVar233 * 1.5 + fVar242 * -0.5 * fVar233 * fVar233 * fVar233;
                auVar110 = vdpps_avx(_local_960,local_a10,0x7f);
                local_a40._0_16_ = vfnmadd231ss_fma(auVar159,auVar103,ZEXT416((uint)fVar100));
                auVar159 = vfnmadd231ss_fma(auVar110,auVar103,auVar135);
                if (fVar242 < 0.0) {
                  local_a80._0_16_ = ZEXT416((uint)fVar100);
                  local_9a0._0_4_ = fVar233;
                  local_840._0_16_ = auVar159;
                  fVar242 = sqrtf(fVar242);
                  auVar273 = ZEXT464(auVar183._0_4_);
                  auVar278 = ZEXT464((uint)local_b20._0_4_);
                  fVar233 = (float)local_9a0._0_4_;
                  auVar159 = local_840._0_16_;
                  auVar110 = local_a80._0_16_;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar102,auVar102);
                  fVar242 = auVar110._0_4_;
                  auVar110 = ZEXT416((uint)fVar100);
                }
                auVar259 = ZEXT3264(local_b60);
                auVar102 = vpermilps_avx(local_820._0_16_,0xff);
                fVar242 = fVar242 - auVar102._0_4_;
                auVar102 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                auVar183 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar233),auVar102);
                auVar187._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
                auVar187._8_4_ = auVar135._8_4_ ^ 0x80000000;
                auVar187._12_4_ = auVar135._12_4_ ^ 0x80000000;
                auVar204._0_8_ = auVar183._0_8_ ^ 0x8000000080000000;
                auVar204._8_4_ = auVar183._8_4_ ^ 0x80000000;
                auVar204._12_4_ = auVar183._12_4_ ^ 0x80000000;
                auVar159 = ZEXT416((uint)(auVar159._0_4_ * fVar233));
                auVar135 = vfmsub231ss_fma(ZEXT416((uint)(auVar183._0_4_ * auVar135._0_4_)),auVar110
                                           ,auVar159);
                auVar159 = vinsertps_avx(auVar204,auVar159,0x1c);
                uVar99 = auVar135._0_4_;
                auVar205._4_4_ = uVar99;
                auVar205._0_4_ = uVar99;
                auVar205._8_4_ = uVar99;
                auVar205._12_4_ = uVar99;
                auVar159 = vdivps_avx(auVar159,auVar205);
                auVar110 = vinsertps_avx(auVar110,auVar187,0x10);
                auVar110 = vdivps_avx(auVar110,auVar205);
                auVar160._0_4_ = fVar241 * auVar159._0_4_ + fVar242 * auVar110._0_4_;
                auVar160._4_4_ = fVar241 * auVar159._4_4_ + fVar242 * auVar110._4_4_;
                auVar160._8_4_ = fVar241 * auVar159._8_4_ + fVar242 * auVar110._8_4_;
                auVar160._12_4_ = fVar241 * auVar159._12_4_ + fVar242 * auVar110._12_4_;
                auVar159 = vsubps_avx(auVar265._0_16_,auVar160);
                auVar265 = ZEXT1664(auVar159);
                auVar103 = vandps_avx(auVar103,auVar234);
                if (auVar103._0_4_ < auVar273._0_4_) {
                  auVar110 = vfmadd231ss_fma(ZEXT416((uint)(auVar278._0_4_ + auVar273._0_4_)),
                                             local_a00._0_16_,ZEXT416(0x36000000));
                  auVar103 = vandps_avx(ZEXT416((uint)fVar242),auVar234);
                  if (auVar103._0_4_ < auVar110._0_4_) {
                    fVar100 = auVar159._0_4_ + (float)local_920._0_4_;
                    if (fVar100 < fVar98) break;
                    fVar233 = *(float *)(ray + k * 4 + 0x100);
                    auVar273 = ZEXT464((uint)fVar233);
                    if (fVar233 < fVar100) break;
                    auVar103 = vmovshdup_avx(auVar159);
                    fVar241 = auVar103._0_4_;
                    if ((fVar241 < 0.0) || (1.0 < fVar241)) break;
                    auVar104 = vrsqrtss_avx(auVar104,auVar104);
                    fVar242 = auVar104._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar89].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar201 = fVar242 * 1.5 + fVar201 * -0.5 * fVar242 * fVar242 * fVar242;
                    auVar188._0_4_ = fVar201 * (float)local_960._0_4_;
                    auVar188._4_4_ = fVar201 * (float)local_960._4_4_;
                    auVar188._8_4_ = fVar201 * fStack_958;
                    auVar188._12_4_ = fVar201 * fStack_954;
                    auVar135 = vfmadd213ps_fma(auVar102,auVar188,local_b00._0_16_);
                    auVar104 = vshufps_avx(auVar188,auVar188,0xc9);
                    auVar110 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                    auVar189._0_4_ = auVar188._0_4_ * auVar110._0_4_;
                    auVar189._4_4_ = auVar188._4_4_ * auVar110._4_4_;
                    auVar189._8_4_ = auVar188._8_4_ * auVar110._8_4_;
                    auVar189._12_4_ = auVar188._12_4_ * auVar110._12_4_;
                    auVar102 = vfmsub231ps_fma(auVar189,local_b00._0_16_,auVar104);
                    auVar104 = vshufps_avx(auVar102,auVar102,0xc9);
                    auVar110 = vshufps_avx(auVar135,auVar135,0xc9);
                    auVar102 = vshufps_avx(auVar102,auVar102,0xd2);
                    auVar140._0_4_ = auVar135._0_4_ * auVar102._0_4_;
                    auVar140._4_4_ = auVar135._4_4_ * auVar102._4_4_;
                    auVar140._8_4_ = auVar135._8_4_ * auVar102._8_4_;
                    auVar140._12_4_ = auVar135._12_4_ * auVar102._12_4_;
                    auVar104 = vfmsub231ps_fma(auVar140,auVar104,auVar110);
                    uVar99 = auVar104._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar100;
                      uVar3 = vextractps_avx(auVar104,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                      uVar3 = vextractps_avx(auVar104,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar99;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar241;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_9c0;
                      *(uint *)(ray + k * 4 + 0x240) = uVar89;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar6 = context->user;
                    local_3c0 = auVar103._0_8_;
                    auVar103 = vmovshdup_avx(auVar104);
                    local_420._8_8_ = auVar103._0_8_;
                    auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
                    local_400 = auVar104._0_8_;
                    local_420._0_8_ = local_420._8_8_;
                    local_420._16_8_ = local_420._8_8_;
                    local_420._24_8_ = local_420._8_8_;
                    uStack_3f8 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3e8 = local_400;
                    local_3e0 = uVar99;
                    uStack_3dc = uVar99;
                    uStack_3d8 = uVar99;
                    uStack_3d4 = uVar99;
                    uStack_3d0 = uVar99;
                    uStack_3cc = uVar99;
                    uStack_3c8 = uVar99;
                    uStack_3c4 = uVar99;
                    uStack_3b8 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3a8 = local_3c0;
                    auVar161._12_4_ = 0;
                    auVar161._0_12_ = ZEXT812(0);
                    auVar161 = auVar161 << 0x20;
                    local_3a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_380 = CONCAT44(uStack_65c,local_660);
                    uStack_378 = CONCAT44(uStack_654,uStack_658);
                    uStack_370 = CONCAT44(uStack_64c,uStack_650);
                    uStack_368 = CONCAT44(uStack_644,uStack_648);
                    local_360._4_4_ = uStack_63c;
                    local_360._0_4_ = local_640;
                    local_360._8_4_ = uStack_638;
                    local_360._12_4_ = uStack_634;
                    local_360._16_4_ = uStack_630;
                    local_360._20_4_ = uStack_62c;
                    local_360._24_4_ = uStack_628;
                    local_360._28_4_ = uStack_624;
                    auVar114 = vpcmpeqd_avx2(local_360,local_360);
                    local_aa8[1] = auVar114;
                    *local_aa8 = auVar114;
                    local_340 = pRVar6->instID[0];
                    uStack_33c = local_340;
                    uStack_338 = local_340;
                    uStack_334 = local_340;
                    uStack_330 = local_340;
                    uStack_32c = local_340;
                    uStack_328 = local_340;
                    uStack_324 = local_340;
                    local_320 = pRVar6->instPrimID[0];
                    uStack_31c = local_320;
                    uStack_318 = local_320;
                    uStack_314 = local_320;
                    uStack_310 = local_320;
                    uStack_30c = local_320;
                    uStack_308 = local_320;
                    uStack_304 = local_320;
                    *(float *)(ray + k * 4 + 0x100) = fVar100;
                    local_940 = local_6a0;
                    local_b90.valid = (int *)local_940;
                    local_b90.geometryUserPtr = pGVar4->userPtr;
                    local_b90.context = context->user;
                    local_b90.hit = (RTCHitN *)local_420;
                    local_b90.N = 8;
                    local_b90.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar265 = ZEXT1664(auVar159);
                      auVar278 = ZEXT1664(auVar278._0_16_);
                      (*pGVar4->intersectionFilterN)(&local_b90);
                      auVar259 = ZEXT3264(local_b60);
                      auVar161 = ZEXT816(0) << 0x40;
                    }
                    auVar179 = ZEXT1632(auVar161);
                    auVar114 = vpcmpeqd_avx2(local_940,auVar179);
                    auVar114 = _DAT_01fe9960 & ~auVar114;
                    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar114 >> 0x7f,0) != '\0') ||
                          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar114 >> 0xbf,0) != '\0') ||
                        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar114[0x1f] < '\0') {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar265 = ZEXT1664(auVar265._0_16_);
                        auVar278 = ZEXT1664(auVar278._0_16_);
                        (*p_Var5)(&local_b90);
                        auVar259 = ZEXT3264(local_b60);
                        auVar179 = ZEXT832(0) << 0x40;
                      }
                      auVar273 = ZEXT464((uint)fVar233);
                      auVar179 = vpcmpeqd_avx2(local_940,auVar179);
                      auVar114 = _DAT_01fe9960 & ~auVar179;
                      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar114 >> 0x7f,0) != '\0') ||
                            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar114 >> 0xbf,0) != '\0') ||
                          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar114[0x1f] < '\0') {
                        auVar129._0_8_ = auVar179._0_8_ ^ 0xffffffffffffffff;
                        auVar129._8_4_ = auVar179._8_4_ ^ 0xffffffff;
                        auVar129._12_4_ = auVar179._12_4_ ^ 0xffffffff;
                        auVar129._16_4_ = auVar179._16_4_ ^ 0xffffffff;
                        auVar129._20_4_ = auVar179._20_4_ ^ 0xffffffff;
                        auVar129._24_4_ = auVar179._24_4_ ^ 0xffffffff;
                        auVar129._28_4_ = auVar179._28_4_ ^ 0xffffffff;
                        auVar114 = vmaskmovps_avx(auVar129,*(undefined1 (*) [32])local_b90.hit);
                        *(undefined1 (*) [32])(local_b90.ray + 0x180) = auVar114;
                        auVar114 = vmaskmovps_avx(auVar129,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x20));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1a0) = auVar114;
                        auVar114 = vmaskmovps_avx(auVar129,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x40));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1c0) = auVar114;
                        auVar114 = vmaskmovps_avx(auVar129,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x60));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1e0) = auVar114;
                        auVar114 = vmaskmovps_avx(auVar129,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x80));
                        *(undefined1 (*) [32])(local_b90.ray + 0x200) = auVar114;
                        auVar114 = vpmaskmovd_avx2(auVar129,*(undefined1 (*) [32])
                                                             (local_b90.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x220) = auVar114;
                        auVar114 = vpmaskmovd_avx2(auVar129,*(undefined1 (*) [32])
                                                             (local_b90.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x240) = auVar114;
                        auVar114 = vpmaskmovd_avx2(auVar129,*(undefined1 (*) [32])
                                                             (local_b90.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x260) = auVar114;
                        auVar114 = vpmaskmovd_avx2(auVar129,*(undefined1 (*) [32])
                                                             (local_b90.hit + 0x100));
                        *(undefined1 (*) [32])(local_b90.ray + 0x280) = auVar114;
                        break;
                      }
                    }
                    auVar273 = ZEXT464((uint)fVar233);
                    *(float *)(ray + k * 4 + 0x100) = fVar233;
                    break;
                  }
                }
                lVar94 = lVar94 + -1;
              } while (lVar94 != 0);
              uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar127._4_4_ = uVar99;
              auVar127._0_4_ = uVar99;
              auVar127._8_4_ = uVar99;
              auVar127._12_4_ = uVar99;
              auVar127._16_4_ = uVar99;
              auVar127._20_4_ = uVar99;
              auVar127._24_4_ = uVar99;
              auVar127._28_4_ = uVar99;
              auVar179 = vcmpps_avx(_local_8a0,auVar127,2);
              auVar114 = vandps_avx(auVar179,local_700);
              auVar181 = ZEXT3264(auVar114);
              auVar179 = local_700 & auVar179;
              local_700 = auVar114;
            } while ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar179 >> 0x7f,0) != '\0') ||
                       (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar179 >> 0xbf,0) != '\0') ||
                     (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar179[0x1f] < '\0');
            auVar181 = ZEXT3264(local_300);
            auVar289 = ZEXT3264(local_b40);
            auVar240 = ZEXT3264(local_7c0);
          }
          auVar154._0_4_ = auVar289._0_4_ * (float)local_800._0_4_;
          auVar154._4_4_ = auVar289._4_4_ * (float)local_800._4_4_;
          auVar154._8_4_ = auVar289._8_4_ * fStack_7f8;
          auVar154._12_4_ = auVar289._12_4_ * fStack_7f4;
          auVar154._16_4_ = auVar289._16_4_ * fStack_7f0;
          auVar154._20_4_ = auVar289._20_4_ * fStack_7ec;
          auVar154._28_36_ = auVar181._28_36_;
          auVar154._24_4_ = auVar289._24_4_ * fStack_7e8;
          auVar104 = vfmadd213ps_fma(local_900,_local_860,auVar154._0_32_);
          auVar104 = vfmadd213ps_fma(local_8e0,_local_880,ZEXT1632(auVar104));
          auVar64._4_4_ = uStack_8bc;
          auVar64._0_4_ = local_8c0;
          auVar64._8_4_ = uStack_8b8;
          auVar64._12_4_ = uStack_8b4;
          auVar64._16_4_ = uStack_8b0;
          auVar64._20_4_ = uStack_8ac;
          auVar64._24_4_ = uStack_8a8;
          auVar64._28_4_ = uStack_8a4;
          auVar114 = vandps_avx(ZEXT1632(auVar104),auVar64);
          auVar176._8_4_ = 0x3e99999a;
          auVar176._0_8_ = 0x3e99999a3e99999a;
          auVar176._12_4_ = 0x3e99999a;
          auVar176._16_4_ = 0x3e99999a;
          auVar176._20_4_ = 0x3e99999a;
          auVar176._24_4_ = 0x3e99999a;
          auVar176._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar176,1);
          auVar179 = vorps_avx(auVar114,local_780);
          auVar177._0_4_ = auVar259._0_4_ + (float)local_980._0_4_;
          auVar177._4_4_ = auVar259._4_4_ + (float)local_980._4_4_;
          auVar177._8_4_ = auVar259._8_4_ + fStack_978;
          auVar177._12_4_ = auVar259._12_4_ + fStack_974;
          auVar177._16_4_ = auVar259._16_4_ + fStack_970;
          auVar177._20_4_ = auVar259._20_4_ + fStack_96c;
          auVar177._24_4_ = auVar259._24_4_ + fStack_968;
          auVar177._28_4_ = auVar259._28_4_ + fStack_964;
          auVar114 = vcmpps_avx(auVar177,auVar127,2);
          local_8e0 = vandps_avx(auVar114,auVar240._0_32_);
          auVar178._8_4_ = 3;
          auVar178._0_8_ = 0x300000003;
          auVar178._12_4_ = 3;
          auVar178._16_4_ = 3;
          auVar178._20_4_ = 3;
          auVar178._24_4_ = 3;
          auVar178._28_4_ = 3;
          auVar199._8_4_ = 2;
          auVar199._0_8_ = 0x200000002;
          auVar199._12_4_ = 2;
          auVar199._16_4_ = 2;
          auVar199._20_4_ = 2;
          auVar199._24_4_ = 2;
          auVar199._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar199,auVar178,auVar179);
          local_900 = vpcmpgtd_avx2(auVar114,local_7a0);
          auVar114 = vpandn_avx2(local_900,local_8e0);
          auVar179 = local_8e0 & ~local_900;
          local_720 = auVar114;
          if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar179 >> 0x7f,0) != '\0') ||
                (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar179 >> 0xbf,0) != '\0') ||
              (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar179[0x1f] < '\0') {
            auVar103 = vminps_avx(auVar10,auVar12);
            auVar104 = vmaxps_avx(auVar10,auVar12);
            auVar159 = vminps_avx(auVar11,auVar9);
            auVar110 = vminps_avx(auVar103,auVar159);
            auVar103 = vmaxps_avx(auVar11,auVar9);
            auVar159 = vmaxps_avx(auVar104,auVar103);
            auVar104 = vandps_avx(auVar110,auVar234);
            auVar103 = vandps_avx(auVar159,auVar234);
            auVar104 = vmaxps_avx(auVar104,auVar103);
            auVar103 = vmovshdup_avx(auVar104);
            auVar103 = vmaxss_avx(auVar103,auVar104);
            auVar104 = vshufpd_avx(auVar104,auVar104,1);
            auVar104 = vmaxss_avx(auVar104,auVar103);
            local_ae0._0_4_ = auVar104._0_4_ * 1.9073486e-06;
            local_840._0_16_ = vshufps_avx(auVar159,auVar159,0xff);
            local_8a0._4_4_ = (float)local_980._4_4_ + local_300._4_4_;
            local_8a0._0_4_ = (float)local_980._0_4_ + local_300._0_4_;
            fStack_898 = fStack_978 + local_300._8_4_;
            fStack_894 = fStack_974 + local_300._12_4_;
            fStack_890 = fStack_970 + local_300._16_4_;
            fStack_88c = fStack_96c + local_300._20_4_;
            fStack_888 = fStack_968 + local_300._24_4_;
            fStack_884 = fStack_964 + local_300._28_4_;
            local_a00 = local_300;
            do {
              auVar130._8_4_ = 0x7f800000;
              auVar130._0_8_ = 0x7f8000007f800000;
              auVar130._12_4_ = 0x7f800000;
              auVar130._16_4_ = 0x7f800000;
              auVar130._20_4_ = 0x7f800000;
              auVar130._24_4_ = 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar179 = vblendvps_avx(auVar130,local_a00,auVar114);
              auVar115 = vshufps_avx(auVar179,auVar179,0xb1);
              auVar115 = vminps_avx(auVar179,auVar115);
              auVar13 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar13);
              auVar13 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar13);
              auVar115 = vcmpps_avx(auVar179,auVar115,0);
              auVar13 = auVar114 & auVar115;
              auVar179 = auVar114;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar179 = vandps_avx(auVar115,auVar114);
              }
              uVar92 = vmovmskps_avx(auVar179);
              iVar22 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                iVar22 = iVar22 + 1;
              }
              uVar93 = iVar22 << 2;
              local_720 = auVar114;
              *(undefined4 *)(local_720 + uVar93) = 0;
              uVar92 = *(uint *)(local_1c0 + uVar93);
              uVar93 = *(uint *)(local_2e0 + uVar93);
              fVar201 = auVar8._0_4_;
              if ((float)local_a20._0_4_ < 0.0) {
                fVar201 = sqrtf((float)local_a20._0_4_);
              }
              local_a40._0_4_ = fVar201 * 1.9073486e-06;
              auVar104 = vinsertps_avx(ZEXT416(uVar93),ZEXT416(uVar92),0x10);
              auVar265 = ZEXT1664(auVar104);
              lVar94 = 5;
              do {
                uVar99 = auVar265._0_4_;
                auVar109._4_4_ = uVar99;
                auVar109._0_4_ = uVar99;
                auVar109._8_4_ = uVar99;
                auVar109._12_4_ = uVar99;
                auVar103 = vfmadd213ps_fma(auVar109,local_a10,_DAT_01f7aa10);
                auVar183 = auVar265._0_16_;
                local_b00._0_16_ = vmovshdup_avx(auVar183);
                fVar243 = local_b00._0_4_;
                fVar242 = 1.0 - fVar243;
                auVar289 = ZEXT464((uint)fVar242);
                auVar135 = SUB6416(ZEXT464(0x40400000),0);
                auVar102 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar159 = vfmadd213ss_fma(auVar135,local_b00._0_16_,auVar102);
                auVar104 = vfmadd213ss_fma(auVar159,ZEXT416((uint)(fVar243 * fVar243)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar110 = vfmadd213ss_fma(auVar135,ZEXT416((uint)fVar242),auVar102);
                auVar110 = vfmadd213ss_fma(auVar110,ZEXT416((uint)(fVar242 * fVar242)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar201 = fVar242 * fVar242 * -fVar243 * 0.5;
                fVar100 = auVar104._0_4_ * 0.5;
                fVar233 = auVar110._0_4_ * 0.5;
                fVar241 = fVar243 * fVar243 * -fVar242 * 0.5;
                auVar190._0_4_ = fVar241 * fVar133;
                auVar190._4_4_ = fVar241 * fStack_bcc;
                auVar190._8_4_ = fVar241 * fStack_bc8;
                auVar190._12_4_ = fVar241 * fStack_bc4;
                auVar206._4_4_ = fVar233;
                auVar206._0_4_ = fVar233;
                auVar206._8_4_ = fVar233;
                auVar206._12_4_ = fVar233;
                auVar104 = vfmadd132ps_fma(auVar206,auVar190,auVar11);
                auVar162._4_4_ = fVar100;
                auVar162._0_4_ = fVar100;
                auVar162._8_4_ = fVar100;
                auVar162._12_4_ = fVar100;
                auVar104 = vfmadd132ps_fma(auVar162,auVar104,auVar12);
                auVar191._4_4_ = fVar201;
                auVar191._0_4_ = fVar201;
                auVar191._8_4_ = fVar201;
                auVar191._12_4_ = fVar201;
                auVar104 = vfmadd132ps_fma(auVar191,auVar104,auVar10);
                auVar102 = vfmadd231ss_fma(auVar102,local_b00._0_16_,ZEXT416(0x41100000));
                auVar110 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_b00._0_16_,
                                           ZEXT416(0x40800000));
                local_b20._0_16_ = auVar110;
                local_820._0_16_ = auVar104;
                auVar104 = vsubps_avx(auVar103,auVar104);
                _local_960 = auVar104;
                auVar104 = vdpps_avx(auVar104,auVar104,0x7f);
                auVar103 = vfmadd213ss_fma(auVar135,local_b00._0_16_,ZEXT416(0xbf800000));
                fVar201 = auVar104._0_4_;
                if (fVar201 < 0.0) {
                  local_a60._0_4_ = auVar159._0_4_;
                  local_b60._0_16_ = ZEXT416((uint)fVar242);
                  local_a80._0_4_ = fVar242 * -2.0;
                  auVar259._0_4_ = sqrtf(fVar201);
                  auVar259._4_60_ = extraout_var_00;
                  auVar289 = ZEXT1664(local_b60._0_16_);
                  auVar159 = ZEXT416((uint)local_a60._0_4_);
                  auVar265 = ZEXT1664(auVar183);
                  auVar110 = auVar259._0_16_;
                  fVar100 = (float)local_a80._0_4_;
                }
                else {
                  auVar110 = vsqrtss_avx(auVar104,auVar104);
                  fVar100 = fVar242 * -2.0;
                }
                fVar241 = auVar289._0_4_;
                fVar233 = local_b00._0_4_;
                auVar135 = vfmadd213ss_fma(auVar159,ZEXT416((uint)(fVar233 + fVar233)),
                                           ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
                auVar134 = SUB6416(ZEXT464(0x40000000),0);
                auVar159 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_b00._0_16_,auVar134)
                ;
                auVar166 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * fVar241 * -3.0)),
                                           ZEXT416((uint)(fVar241 + fVar241)),auVar159);
                auVar202 = auVar289._0_16_;
                auVar101 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar241 + fVar241))),auVar202,
                                            auVar202);
                auVar159 = vfmadd213ss_fma(ZEXT416((uint)fVar100),local_b00._0_16_,
                                           ZEXT416((uint)(fVar243 * fVar243)));
                fVar100 = auVar166._0_4_ * 0.5;
                fVar233 = auVar159._0_4_ * 0.5;
                auVar163._0_4_ = fVar133 * fVar233;
                auVar163._4_4_ = fStack_bcc * fVar233;
                auVar163._8_4_ = fStack_bc8 * fVar233;
                auVar163._12_4_ = fStack_bc4 * fVar233;
                auVar141._4_4_ = fVar100;
                auVar141._0_4_ = fVar100;
                auVar141._8_4_ = fVar100;
                auVar141._12_4_ = fVar100;
                auVar159 = vfmadd213ps_fma(auVar141,auVar11,auVar163);
                fVar100 = auVar101._0_4_ * 0.5;
                fVar233 = auVar135._0_4_ * 0.5;
                auVar164._4_4_ = fVar233;
                auVar164._0_4_ = fVar233;
                auVar164._8_4_ = fVar233;
                auVar164._12_4_ = fVar233;
                auVar159 = vfmadd213ps_fma(auVar164,auVar12,auVar159);
                auVar269._4_4_ = fVar100;
                auVar269._0_4_ = fVar100;
                auVar269._8_4_ = fVar100;
                auVar269._12_4_ = fVar100;
                auVar135 = vfmadd213ps_fma(auVar269,auVar10,auVar159);
                auVar166 = vfmadd213ss_fma(local_b00._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar134)
                ;
                local_c00 = auVar103._0_4_;
                auVar111._0_4_ = fVar133 * local_c00;
                auVar111._4_4_ = fStack_bcc * local_c00;
                auVar111._8_4_ = fStack_bc8 * local_c00;
                auVar111._12_4_ = fStack_bc4 * local_c00;
                auVar142._4_4_ = local_b20._0_4_;
                auVar142._0_4_ = local_b20._0_4_;
                auVar142._8_4_ = local_b20._0_4_;
                auVar142._12_4_ = local_b20._0_4_;
                auVar103 = vfmadd213ps_fma(auVar142,auVar11,auVar111);
                uVar99 = auVar102._0_4_;
                auVar165._4_4_ = uVar99;
                auVar165._0_4_ = uVar99;
                auVar165._8_4_ = uVar99;
                auVar165._12_4_ = uVar99;
                auVar103 = vfmadd213ps_fma(auVar165,auVar12,auVar103);
                auVar159 = vdpps_avx(auVar135,auVar135,0x7f);
                uVar99 = auVar166._0_4_;
                auVar143._4_4_ = uVar99;
                auVar143._0_4_ = uVar99;
                auVar143._8_4_ = uVar99;
                auVar143._12_4_ = uVar99;
                auVar166 = vfmadd213ps_fma(auVar143,auVar10,auVar103);
                auVar103 = vblendps_avx(auVar159,_DAT_01f7aa10,0xe);
                auVar102 = vrsqrtss_avx(auVar103,auVar103);
                fVar241 = auVar159._0_4_;
                fVar100 = auVar102._0_4_;
                auVar102 = vdpps_avx(auVar135,auVar166,0x7f);
                fVar100 = fVar100 * 1.5 + fVar241 * -0.5 * fVar100 * fVar100 * fVar100;
                auVar144._0_4_ = auVar166._0_4_ * fVar241;
                auVar144._4_4_ = auVar166._4_4_ * fVar241;
                auVar144._8_4_ = auVar166._8_4_ * fVar241;
                auVar144._12_4_ = auVar166._12_4_ * fVar241;
                fVar233 = auVar102._0_4_;
                auVar221._0_4_ = auVar135._0_4_ * fVar233;
                auVar221._4_4_ = auVar135._4_4_ * fVar233;
                fVar242 = auVar135._8_4_;
                auVar221._8_4_ = fVar242 * fVar233;
                fVar243 = auVar135._12_4_;
                auVar221._12_4_ = fVar243 * fVar233;
                auVar102 = vsubps_avx(auVar144,auVar221);
                auVar103 = vrcpss_avx(auVar103,auVar103);
                auVar166 = vfnmadd213ss_fma(auVar103,auVar159,auVar134);
                fVar233 = auVar103._0_4_ * auVar166._0_4_;
                auVar103 = vmaxss_avx(ZEXT416((uint)local_ae0._0_4_),
                                      ZEXT416((uint)(auVar265._0_4_ * (float)local_a40._0_4_)));
                auVar259 = ZEXT1664(auVar103);
                auVar237._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
                auVar237._8_4_ = -fVar242;
                auVar237._12_4_ = -fVar243;
                auVar192._0_4_ = fVar100 * auVar102._0_4_ * fVar233;
                auVar192._4_4_ = fVar100 * auVar102._4_4_ * fVar233;
                auVar192._8_4_ = fVar100 * auVar102._8_4_ * fVar233;
                auVar192._12_4_ = fVar100 * auVar102._12_4_ * fVar233;
                auVar264._0_4_ = auVar135._0_4_ * fVar100;
                auVar264._4_4_ = auVar135._4_4_ * fVar100;
                auVar264._8_4_ = fVar242 * fVar100;
                auVar264._12_4_ = fVar243 * fVar100;
                local_b00._0_16_ = auVar135;
                local_b20._0_4_ = auVar103._0_4_;
                if (fVar241 < -fVar241) {
                  local_a60._0_16_ = auVar237;
                  local_b60._0_16_ = auVar264;
                  auVar289 = ZEXT1664(auVar202);
                  fVar100 = sqrtf(fVar241);
                  auVar259 = ZEXT464((uint)local_b20._0_4_);
                  auVar110 = ZEXT416(auVar110._0_4_);
                  auVar237 = local_a60._0_16_;
                  auVar264 = local_b60._0_16_;
                }
                else {
                  auVar103 = vsqrtss_avx(auVar159,auVar159);
                  fVar100 = auVar103._0_4_;
                }
                auVar103 = vdpps_avx(_local_960,auVar264,0x7f);
                auVar166 = vfmadd213ss_fma(ZEXT416((uint)local_ae0._0_4_),auVar110,auVar259._0_16_);
                auVar159 = vdpps_avx(auVar237,auVar264,0x7f);
                auVar102 = vdpps_avx(_local_960,auVar192,0x7f);
                auVar135 = vdpps_avx(local_a10,auVar264,0x7f);
                auVar166 = vfmadd213ss_fma(ZEXT416((uint)(auVar110._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_ae0._0_4_ / fVar100)),
                                           auVar166);
                auVar273 = ZEXT1664(auVar166);
                fVar100 = auVar159._0_4_ + auVar102._0_4_;
                auVar278 = ZEXT464((uint)fVar100);
                fVar241 = auVar103._0_4_;
                auVar112._0_4_ = fVar241 * fVar241;
                auVar112._4_4_ = auVar103._4_4_ * auVar103._4_4_;
                auVar112._8_4_ = auVar103._8_4_ * auVar103._8_4_;
                auVar112._12_4_ = auVar103._12_4_ * auVar103._12_4_;
                auVar159 = vdpps_avx(_local_960,auVar237,0x7f);
                auVar102 = vsubps_avx(auVar104,auVar112);
                auVar110 = vrsqrtss_avx(auVar102,auVar102);
                fVar242 = auVar102._0_4_;
                fVar233 = auVar110._0_4_;
                fVar233 = fVar233 * 1.5 + fVar242 * -0.5 * fVar233 * fVar233 * fVar233;
                auVar110 = vdpps_avx(_local_960,local_a10,0x7f);
                auVar159 = vfnmadd231ss_fma(auVar159,auVar103,ZEXT416((uint)fVar100));
                auVar110 = vfnmadd231ss_fma(auVar110,auVar103,auVar135);
                if (fVar242 < 0.0) {
                  local_a60._0_4_ = auVar166._0_4_;
                  local_b60._0_16_ = ZEXT416((uint)fVar100);
                  local_a80._0_4_ = fVar233;
                  local_9a0._0_16_ = auVar110;
                  auVar289 = ZEXT1664(auVar289._0_16_);
                  fVar100 = sqrtf(fVar242);
                  auVar278 = ZEXT1664(local_b60._0_16_);
                  auVar273 = ZEXT464((uint)local_a60._0_4_);
                  auVar259 = ZEXT464((uint)local_b20._0_4_);
                  fVar233 = (float)local_a80._0_4_;
                  auVar110 = local_9a0._0_16_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar100 = auVar102._0_4_;
                }
                auVar240 = ZEXT1664(local_b00._0_16_);
                auVar102 = vpermilps_avx(local_820._0_16_,0xff);
                fVar100 = fVar100 - auVar102._0_4_;
                auVar102 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                auVar159 = vfmsub213ss_fma(auVar159,ZEXT416((uint)fVar233),auVar102);
                auVar193._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
                auVar193._8_4_ = auVar135._8_4_ ^ 0x80000000;
                auVar193._12_4_ = auVar135._12_4_ ^ 0x80000000;
                auVar207._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
                auVar207._8_4_ = auVar159._8_4_ ^ 0x80000000;
                auVar207._12_4_ = auVar159._12_4_ ^ 0x80000000;
                auVar166 = ZEXT416((uint)(auVar110._0_4_ * fVar233));
                auVar101 = auVar278._0_16_;
                auVar110 = vfmsub231ss_fma(ZEXT416((uint)(auVar135._0_4_ * auVar159._0_4_)),auVar101
                                           ,auVar166);
                auVar159 = vinsertps_avx(auVar207,auVar166,0x1c);
                uVar99 = auVar110._0_4_;
                auVar208._4_4_ = uVar99;
                auVar208._0_4_ = uVar99;
                auVar208._8_4_ = uVar99;
                auVar208._12_4_ = uVar99;
                auVar159 = vdivps_avx(auVar159,auVar208);
                auVar110 = vinsertps_avx(auVar101,auVar193,0x10);
                auVar110 = vdivps_avx(auVar110,auVar208);
                auVar167._0_4_ = fVar241 * auVar159._0_4_ + fVar100 * auVar110._0_4_;
                auVar167._4_4_ = fVar241 * auVar159._4_4_ + fVar100 * auVar110._4_4_;
                auVar167._8_4_ = fVar241 * auVar159._8_4_ + fVar100 * auVar110._8_4_;
                auVar167._12_4_ = fVar241 * auVar159._12_4_ + fVar100 * auVar110._12_4_;
                auVar159 = vsubps_avx(auVar183,auVar167);
                auVar265 = ZEXT1664(auVar159);
                auVar103 = vandps_avx(auVar103,auVar234);
                if (auVar103._0_4_ < auVar273._0_4_) {
                  auVar110 = vfmadd231ss_fma(ZEXT416((uint)(auVar259._0_4_ + auVar273._0_4_)),
                                             local_840._0_16_,ZEXT416(0x36000000));
                  auVar103 = vandps_avx(ZEXT416((uint)fVar100),auVar234);
                  if (auVar103._0_4_ < auVar110._0_4_) {
                    fVar100 = auVar159._0_4_ + (float)local_920._0_4_;
                    if (fVar100 < fVar98) break;
                    fVar233 = *(float *)(ray + k * 4 + 0x100);
                    auVar259 = ZEXT464((uint)fVar233);
                    if (fVar233 < fVar100) break;
                    auVar103 = vmovshdup_avx(auVar159);
                    fVar241 = auVar103._0_4_;
                    if ((fVar241 < 0.0) || (1.0 < fVar241)) break;
                    auVar104 = vrsqrtss_avx(auVar104,auVar104);
                    fVar242 = auVar104._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar89].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    fVar201 = fVar242 * 1.5 + fVar201 * -0.5 * fVar242 * fVar242 * fVar242;
                    auVar194._0_4_ = fVar201 * (float)local_960._0_4_;
                    auVar194._4_4_ = fVar201 * (float)local_960._4_4_;
                    auVar194._8_4_ = fVar201 * fStack_958;
                    auVar194._12_4_ = fVar201 * fStack_954;
                    auVar135 = vfmadd213ps_fma(auVar102,auVar194,local_b00._0_16_);
                    auVar104 = vshufps_avx(auVar194,auVar194,0xc9);
                    auVar110 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                    auVar195._0_4_ = auVar194._0_4_ * auVar110._0_4_;
                    auVar195._4_4_ = auVar194._4_4_ * auVar110._4_4_;
                    auVar195._8_4_ = auVar194._8_4_ * auVar110._8_4_;
                    auVar195._12_4_ = auVar194._12_4_ * auVar110._12_4_;
                    auVar102 = vfmsub231ps_fma(auVar195,local_b00._0_16_,auVar104);
                    auVar104 = vshufps_avx(auVar102,auVar102,0xc9);
                    auVar110 = vshufps_avx(auVar135,auVar135,0xc9);
                    auVar102 = vshufps_avx(auVar102,auVar102,0xd2);
                    auVar145._0_4_ = auVar135._0_4_ * auVar102._0_4_;
                    auVar145._4_4_ = auVar135._4_4_ * auVar102._4_4_;
                    auVar145._8_4_ = auVar135._8_4_ * auVar102._8_4_;
                    auVar145._12_4_ = auVar135._12_4_ * auVar102._12_4_;
                    auVar104 = vfmsub231ps_fma(auVar145,auVar104,auVar110);
                    uVar99 = auVar104._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar100;
                      uVar3 = vextractps_avx(auVar104,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                      uVar3 = vextractps_avx(auVar104,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar99;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar241;
                      *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                      *(int *)(ray + k * 4 + 0x220) = (int)local_9c0;
                      *(uint *)(ray + k * 4 + 0x240) = uVar89;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    pRVar6 = context->user;
                    local_3c0 = auVar103._0_8_;
                    auVar103 = vmovshdup_avx(auVar104);
                    local_420._8_8_ = auVar103._0_8_;
                    auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
                    local_400 = auVar104._0_8_;
                    local_420._0_8_ = local_420._8_8_;
                    local_420._16_8_ = local_420._8_8_;
                    local_420._24_8_ = local_420._8_8_;
                    uStack_3f8 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3e8 = local_400;
                    local_3e0 = uVar99;
                    uStack_3dc = uVar99;
                    uStack_3d8 = uVar99;
                    uStack_3d4 = uVar99;
                    uStack_3d0 = uVar99;
                    uStack_3cc = uVar99;
                    uStack_3c8 = uVar99;
                    uStack_3c4 = uVar99;
                    uStack_3b8 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3a8 = local_3c0;
                    auVar168._12_4_ = 0;
                    auVar168._0_12_ = ZEXT812(0);
                    auVar168 = auVar168 << 0x20;
                    local_3a0 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_380 = CONCAT44(uStack_65c,local_660);
                    uStack_378 = CONCAT44(uStack_654,uStack_658);
                    uStack_370 = CONCAT44(uStack_64c,uStack_650);
                    uStack_368 = CONCAT44(uStack_644,uStack_648);
                    local_360._4_4_ = uStack_63c;
                    local_360._0_4_ = local_640;
                    local_360._8_4_ = uStack_638;
                    local_360._12_4_ = uStack_634;
                    local_360._16_4_ = uStack_630;
                    local_360._20_4_ = uStack_62c;
                    local_360._24_4_ = uStack_628;
                    local_360._28_4_ = uStack_624;
                    auVar114 = vpcmpeqd_avx2(local_360,local_360);
                    local_aa8[1] = auVar114;
                    *local_aa8 = auVar114;
                    local_340 = pRVar6->instID[0];
                    uStack_33c = local_340;
                    uStack_338 = local_340;
                    uStack_334 = local_340;
                    uStack_330 = local_340;
                    uStack_32c = local_340;
                    uStack_328 = local_340;
                    uStack_324 = local_340;
                    local_320 = pRVar6->instPrimID[0];
                    uStack_31c = local_320;
                    uStack_318 = local_320;
                    uStack_314 = local_320;
                    uStack_310 = local_320;
                    uStack_30c = local_320;
                    uStack_308 = local_320;
                    uStack_304 = local_320;
                    *(float *)(ray + k * 4 + 0x100) = fVar100;
                    local_940 = local_6a0;
                    local_b90.valid = (int *)local_940;
                    local_b90.geometryUserPtr = pGVar4->userPtr;
                    local_b90.context = context->user;
                    local_b90.hit = (RTCHitN *)local_420;
                    local_b90.N = 8;
                    local_b90.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar240 = ZEXT1664(local_b00._0_16_);
                      auVar265 = ZEXT1664(auVar159);
                      auVar273 = ZEXT1664(auVar273._0_16_);
                      auVar278 = ZEXT1664(auVar101);
                      auVar289 = ZEXT1664(auVar289._0_16_);
                      (*pGVar4->intersectionFilterN)(&local_b90);
                      auVar168 = ZEXT816(0) << 0x40;
                    }
                    auVar179 = ZEXT1632(auVar168);
                    auVar114 = vpcmpeqd_avx2(local_940,auVar179);
                    auVar114 = _DAT_01fe9960 & ~auVar114;
                    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar114 >> 0x7f,0) != '\0') ||
                          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar114 >> 0xbf,0) != '\0') ||
                        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar114[0x1f] < '\0') {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar240 = ZEXT1664(auVar240._0_16_);
                        auVar265 = ZEXT1664(auVar265._0_16_);
                        auVar273 = ZEXT1664(auVar273._0_16_);
                        auVar278 = ZEXT1664(auVar278._0_16_);
                        auVar289 = ZEXT1664(auVar289._0_16_);
                        (*p_Var5)(&local_b90);
                        auVar179 = ZEXT832(0) << 0x40;
                      }
                      auVar259 = ZEXT464((uint)fVar233);
                      auVar179 = vpcmpeqd_avx2(local_940,auVar179);
                      auVar114 = _DAT_01fe9960 & ~auVar179;
                      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar114 >> 0x7f,0) != '\0') ||
                            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar114 >> 0xbf,0) != '\0') ||
                          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar114[0x1f] < '\0') {
                        auVar131._0_8_ = auVar179._0_8_ ^ 0xffffffffffffffff;
                        auVar131._8_4_ = auVar179._8_4_ ^ 0xffffffff;
                        auVar131._12_4_ = auVar179._12_4_ ^ 0xffffffff;
                        auVar131._16_4_ = auVar179._16_4_ ^ 0xffffffff;
                        auVar131._20_4_ = auVar179._20_4_ ^ 0xffffffff;
                        auVar131._24_4_ = auVar179._24_4_ ^ 0xffffffff;
                        auVar131._28_4_ = auVar179._28_4_ ^ 0xffffffff;
                        auVar114 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])local_b90.hit);
                        *(undefined1 (*) [32])(local_b90.ray + 0x180) = auVar114;
                        auVar114 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x20));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1a0) = auVar114;
                        auVar114 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x40));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1c0) = auVar114;
                        auVar114 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x60));
                        *(undefined1 (*) [32])(local_b90.ray + 0x1e0) = auVar114;
                        auVar114 = vmaskmovps_avx(auVar131,*(undefined1 (*) [32])
                                                            (local_b90.hit + 0x80));
                        *(undefined1 (*) [32])(local_b90.ray + 0x200) = auVar114;
                        auVar114 = vpmaskmovd_avx2(auVar131,*(undefined1 (*) [32])
                                                             (local_b90.hit + 0xa0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x220) = auVar114;
                        auVar114 = vpmaskmovd_avx2(auVar131,*(undefined1 (*) [32])
                                                             (local_b90.hit + 0xc0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x240) = auVar114;
                        auVar114 = vpmaskmovd_avx2(auVar131,*(undefined1 (*) [32])
                                                             (local_b90.hit + 0xe0));
                        *(undefined1 (*) [32])(local_b90.ray + 0x260) = auVar114;
                        auVar114 = vpmaskmovd_avx2(auVar131,*(undefined1 (*) [32])
                                                             (local_b90.hit + 0x100));
                        *(undefined1 (*) [32])(local_b90.ray + 0x280) = auVar114;
                        break;
                      }
                    }
                    auVar259 = ZEXT464((uint)fVar233);
                    *(float *)(ray + k * 4 + 0x100) = fVar233;
                    break;
                  }
                }
                lVar94 = lVar94 + -1;
              } while (lVar94 != 0);
              uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar127._4_4_ = uVar99;
              auVar127._0_4_ = uVar99;
              auVar127._8_4_ = uVar99;
              auVar127._12_4_ = uVar99;
              auVar127._16_4_ = uVar99;
              auVar127._20_4_ = uVar99;
              auVar127._24_4_ = uVar99;
              auVar127._28_4_ = uVar99;
              auVar179 = vcmpps_avx(_local_8a0,auVar127,2);
              auVar114 = vandps_avx(auVar179,local_720);
              auVar179 = local_720 & auVar179;
              local_720 = auVar114;
            } while ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar179 >> 0x7f,0) != '\0') ||
                       (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar179 >> 0xbf,0) != '\0') ||
                     (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar179[0x1f] < '\0');
          }
          auVar180._0_4_ = (float)local_980._0_4_ + local_460._0_4_;
          auVar180._4_4_ = (float)local_980._4_4_ + local_460._4_4_;
          auVar180._8_4_ = fStack_978 + local_460._8_4_;
          auVar180._12_4_ = fStack_974 + local_460._12_4_;
          auVar180._16_4_ = fStack_970 + local_460._16_4_;
          auVar180._20_4_ = fStack_96c + local_460._20_4_;
          auVar180._24_4_ = fStack_968 + local_460._24_4_;
          auVar180._28_4_ = fStack_964 + local_460._28_4_;
          auVar179 = vcmpps_avx(auVar180,auVar127,2);
          auVar114 = vandps_avx(local_760,local_740);
          auVar114 = vandps_avx(auVar179,auVar114);
          auVar200._0_4_ = (float)local_980._0_4_ + local_300._0_4_;
          auVar200._4_4_ = (float)local_980._4_4_ + local_300._4_4_;
          auVar200._8_4_ = fStack_978 + local_300._8_4_;
          auVar200._12_4_ = fStack_974 + local_300._12_4_;
          auVar200._16_4_ = fStack_970 + local_300._16_4_;
          auVar200._20_4_ = fStack_96c + local_300._20_4_;
          auVar200._24_4_ = fStack_968 + local_300._24_4_;
          auVar200._28_4_ = fStack_964 + local_300._28_4_;
          auVar115 = vcmpps_avx(auVar200,auVar127,2);
          auVar179 = vandps_avx(local_900,local_8e0);
          auVar179 = vandps_avx(auVar115,auVar179);
          auVar179 = vorps_avx(auVar114,auVar179);
          if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar179 >> 0x7f,0) != '\0') ||
                (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar179 >> 0xbf,0) != '\0') ||
              (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar179[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar179;
            auVar114 = vblendvps_avx(local_300,local_460,auVar114);
            *(undefined1 (*) [32])(auStack_160 + uVar97 * 0x60) = auVar114;
            uVar1 = vmovlps_avx(local_6b0);
            (&uStack_140)[uVar97 * 0xc] = uVar1;
            aiStack_138[uVar97 * 0x18] = local_cc8 + 1;
            iVar90 = iVar90 + 1;
          }
        }
      }
    }
    if (iVar90 == 0) break;
    uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar124._4_4_ = uVar99;
    auVar124._0_4_ = uVar99;
    auVar124._8_4_ = uVar99;
    auVar124._12_4_ = uVar99;
    auVar124._16_4_ = uVar99;
    auVar124._20_4_ = uVar99;
    auVar124._24_4_ = uVar99;
    auVar124._28_4_ = uVar99;
    uVar92 = -iVar90;
    pauVar91 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar90 - 1) * 0x60);
    fVar201 = (float)local_980._0_4_;
    fVar100 = (float)local_980._4_4_;
    fVar233 = fStack_978;
    fVar241 = fStack_974;
    fVar242 = fStack_970;
    fVar243 = fStack_96c;
    fVar244 = fStack_968;
    fVar245 = fStack_964;
    while( true ) {
      auVar114 = pauVar91[1];
      auVar149._0_4_ = fVar201 + auVar114._0_4_;
      auVar149._4_4_ = fVar100 + auVar114._4_4_;
      auVar149._8_4_ = fVar233 + auVar114._8_4_;
      auVar149._12_4_ = fVar241 + auVar114._12_4_;
      auVar149._16_4_ = fVar242 + auVar114._16_4_;
      auVar149._20_4_ = fVar243 + auVar114._20_4_;
      auVar149._24_4_ = fVar244 + auVar114._24_4_;
      auVar149._28_4_ = fVar245 + auVar114._28_4_;
      auVar115 = vcmpps_avx(auVar149,auVar124,2);
      auVar179 = vandps_avx(auVar115,*pauVar91);
      local_420 = auVar179;
      auVar115 = *pauVar91 & auVar115;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0x7f,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0xbf,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar115[0x1f] < '\0') break;
      pauVar91 = pauVar91 + -3;
      uVar92 = uVar92 + 1;
      fVar201 = (float)local_980._0_4_;
      fVar100 = (float)local_980._4_4_;
      fVar233 = fStack_978;
      fVar241 = fStack_974;
      fVar242 = fStack_970;
      fVar243 = fStack_96c;
      fVar244 = fStack_968;
      fVar245 = fStack_964;
      if (uVar92 == 0) goto LAB_016101f4;
    }
    auVar125._8_4_ = 0x7f800000;
    auVar125._0_8_ = 0x7f8000007f800000;
    auVar125._12_4_ = 0x7f800000;
    auVar125._16_4_ = 0x7f800000;
    auVar125._20_4_ = 0x7f800000;
    auVar125._24_4_ = 0x7f800000;
    auVar125._28_4_ = 0x7f800000;
    auVar114 = vblendvps_avx(auVar125,auVar114,auVar179);
    auVar115 = vshufps_avx(auVar114,auVar114,0xb1);
    auVar115 = vminps_avx(auVar114,auVar115);
    auVar13 = vshufpd_avx(auVar115,auVar115,5);
    auVar115 = vminps_avx(auVar115,auVar13);
    auVar13 = vpermpd_avx2(auVar115,0x4e);
    auVar115 = vminps_avx(auVar115,auVar13);
    auVar114 = vcmpps_avx(auVar114,auVar115,0);
    auVar115 = auVar179 & auVar114;
    if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0x7f,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar115 >> 0xbf,0) != '\0') ||
        (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar115[0x1f] < '\0') {
      auVar179 = vandps_avx(auVar114,auVar179);
    }
    uVar23 = *(ulong *)pauVar91[2];
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar23;
    uVar93 = vmovmskps_avx(auVar179);
    iVar90 = 0;
    for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
      iVar90 = iVar90 + 1;
    }
    *(undefined4 *)(local_420 + (uint)(iVar90 << 2)) = 0;
    uVar93 = ~uVar92;
    if ((((((((local_420 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_420 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_420 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_420 >> 0x7f,0) != '\0') ||
          (local_420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_420 >> 0xbf,0) != '\0') ||
        (local_420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_420[0x1f] < '\0') {
      uVar93 = -uVar92;
    }
    uVar97 = (ulong)uVar93;
    local_cc8 = *(int *)(pauVar91[2] + 8);
    *pauVar91 = local_420;
    uVar99 = (undefined4)uVar23;
    auVar150._4_4_ = uVar99;
    auVar150._0_4_ = uVar99;
    auVar150._8_4_ = uVar99;
    auVar150._12_4_ = uVar99;
    auVar150._16_4_ = uVar99;
    auVar150._20_4_ = uVar99;
    auVar150._24_4_ = uVar99;
    auVar150._28_4_ = uVar99;
    auVar104 = vmovshdup_avx(auVar105);
    auVar104 = vsubps_avx(auVar104,auVar105);
    auVar126._0_4_ = auVar104._0_4_;
    auVar126._4_4_ = auVar126._0_4_;
    auVar126._8_4_ = auVar126._0_4_;
    auVar126._12_4_ = auVar126._0_4_;
    auVar126._16_4_ = auVar126._0_4_;
    auVar126._20_4_ = auVar126._0_4_;
    auVar126._24_4_ = auVar126._0_4_;
    auVar126._28_4_ = auVar126._0_4_;
    auVar104 = vfmadd132ps_fma(auVar126,auVar150,_DAT_01faff20);
    local_460 = ZEXT1632(auVar104);
    local_6b0._8_8_ = 0;
    local_6b0._0_8_ = *(ulong *)(local_460 + (uint)(iVar90 << 2));
  } while( true );
LAB_016101f4:
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar113._4_4_ = uVar99;
  auVar113._0_4_ = uVar99;
  auVar113._8_4_ = uVar99;
  auVar113._12_4_ = uVar99;
  auVar7 = vcmpps_avx(local_6c0,auVar113,2);
  uVar89 = vmovmskps_avx(auVar7);
  uVar89 = (uint)uVar96 & uVar89;
  if (uVar89 == 0) {
    return;
  }
  goto LAB_0160d6fa;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }